

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [28];
  byte bVar75;
  undefined1 auVar76 [32];
  bool bVar77;
  uint uVar78;
  int iVar79;
  ulong uVar80;
  long lVar81;
  ulong uVar82;
  uint uVar83;
  long lVar84;
  ulong uVar85;
  Geometry *geometry;
  undefined8 uVar86;
  float fVar105;
  vint4 bi_2;
  undefined1 auVar87 [16];
  float fVar103;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar93 [32];
  undefined1 auVar91 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar104;
  float fVar106;
  float fVar107;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar92 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined4 uVar111;
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar137 [32];
  undefined1 auVar131 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [64];
  undefined4 uVar172;
  vint4 ai_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar207;
  float fVar208;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar205 [32];
  float fVar209;
  undefined1 auVar206 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_940 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_860 [32];
  undefined8 local_790;
  undefined8 uStack_788;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  LinearSpace3fa *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  ulong local_580;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  float local_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  int local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar138 [32];
  
  PVar6 = prim[1];
  uVar82 = (ulong)(byte)PVar6;
  fVar125 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  auVar87._0_4_ = fVar125 * auVar9._0_4_;
  auVar87._4_4_ = fVar125 * auVar9._4_4_;
  auVar87._8_4_ = fVar125 * auVar9._8_4_;
  auVar87._12_4_ = fVar125 * auVar9._12_4_;
  auVar156._0_4_ = fVar125 * auVar10._0_4_;
  auVar156._4_4_ = fVar125 * auVar10._4_4_;
  auVar156._8_4_ = fVar125 * auVar10._8_4_;
  auVar156._12_4_ = fVar125 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar82 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar80 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar82 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar80 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar202._4_4_ = auVar156._0_4_;
  auVar202._0_4_ = auVar156._0_4_;
  auVar202._8_4_ = auVar156._0_4_;
  auVar202._12_4_ = auVar156._0_4_;
  auVar113 = vshufps_avx(auVar156,auVar156,0x55);
  auVar88 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar125 = auVar88._0_4_;
  auVar188._0_4_ = fVar125 * auVar11._0_4_;
  fVar103 = auVar88._4_4_;
  auVar188._4_4_ = fVar103 * auVar11._4_4_;
  fVar105 = auVar88._8_4_;
  auVar188._8_4_ = fVar105 * auVar11._8_4_;
  fVar124 = auVar88._12_4_;
  auVar188._12_4_ = fVar124 * auVar11._12_4_;
  auVar186._0_4_ = auVar14._0_4_ * fVar125;
  auVar186._4_4_ = auVar14._4_4_ * fVar103;
  auVar186._8_4_ = auVar14._8_4_ * fVar105;
  auVar186._12_4_ = auVar14._12_4_ * fVar124;
  auVar173._0_4_ = auVar126._0_4_ * fVar125;
  auVar173._4_4_ = auVar126._4_4_ * fVar103;
  auVar173._8_4_ = auVar126._8_4_ * fVar105;
  auVar173._12_4_ = auVar126._12_4_ * fVar124;
  auVar88 = vfmadd231ps_fma(auVar188,auVar113,auVar10);
  auVar114 = vfmadd231ps_fma(auVar186,auVar113,auVar13);
  auVar113 = vfmadd231ps_fma(auVar173,auVar89,auVar113);
  auVar146 = vfmadd231ps_fma(auVar88,auVar202,auVar9);
  auVar114 = vfmadd231ps_fma(auVar114,auVar202,auVar12);
  auVar152 = vfmadd231ps_fma(auVar113,auVar90,auVar202);
  auVar203._4_4_ = auVar87._0_4_;
  auVar203._0_4_ = auVar87._0_4_;
  auVar203._8_4_ = auVar87._0_4_;
  auVar203._12_4_ = auVar87._0_4_;
  auVar113 = vshufps_avx(auVar87,auVar87,0x55);
  auVar88 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar125 = auVar88._0_4_;
  auVar157._0_4_ = fVar125 * auVar11._0_4_;
  fVar103 = auVar88._4_4_;
  auVar157._4_4_ = fVar103 * auVar11._4_4_;
  fVar105 = auVar88._8_4_;
  auVar157._8_4_ = fVar105 * auVar11._8_4_;
  fVar124 = auVar88._12_4_;
  auVar157._12_4_ = fVar124 * auVar11._12_4_;
  auVar112._0_4_ = auVar14._0_4_ * fVar125;
  auVar112._4_4_ = auVar14._4_4_ * fVar103;
  auVar112._8_4_ = auVar14._8_4_ * fVar105;
  auVar112._12_4_ = auVar14._12_4_ * fVar124;
  auVar88._0_4_ = auVar126._0_4_ * fVar125;
  auVar88._4_4_ = auVar126._4_4_ * fVar103;
  auVar88._8_4_ = auVar126._8_4_ * fVar105;
  auVar88._12_4_ = auVar126._12_4_ * fVar124;
  auVar10 = vfmadd231ps_fma(auVar157,auVar113,auVar10);
  auVar11 = vfmadd231ps_fma(auVar112,auVar113,auVar13);
  auVar13 = vfmadd231ps_fma(auVar88,auVar113,auVar89);
  auVar14 = vfmadd231ps_fma(auVar10,auVar203,auVar9);
  auVar89 = vfmadd231ps_fma(auVar11,auVar203,auVar12);
  auVar126 = vfmadd231ps_fma(auVar13,auVar203,auVar90);
  local_3f0._8_4_ = 0x7fffffff;
  local_3f0._0_8_ = 0x7fffffff7fffffff;
  local_3f0._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar146,local_3f0);
  auVar151._8_4_ = 0x219392ef;
  auVar151._0_8_ = 0x219392ef219392ef;
  auVar151._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar151,1);
  auVar10 = vblendvps_avx(auVar146,auVar151,auVar9);
  auVar9 = vandps_avx(auVar114,local_3f0);
  auVar9 = vcmpps_avx(auVar9,auVar151,1);
  auVar11 = vblendvps_avx(auVar114,auVar151,auVar9);
  auVar9 = vandps_avx(auVar152,local_3f0);
  auVar9 = vcmpps_avx(auVar9,auVar151,1);
  auVar9 = vblendvps_avx(auVar152,auVar151,auVar9);
  auVar12 = vrcpps_avx(auVar10);
  auVar168._8_4_ = 0x3f800000;
  auVar168._0_8_ = 0x3f8000003f800000;
  auVar168._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar12,auVar168);
  auVar12 = vfmadd132ps_fma(auVar10,auVar12,auVar12);
  auVar10 = vrcpps_avx(auVar11);
  auVar11 = vfnmadd213ps_fma(auVar11,auVar10,auVar168);
  auVar13 = vfmadd132ps_fma(auVar11,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar168);
  auVar90 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar14);
  auVar152._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar152._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar152._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar152._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar14);
  auVar158._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar158._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar158._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar158._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar114._1_3_ = 0;
  auVar114[0] = PVar6;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar82 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar89);
  auVar174._0_4_ = auVar9._0_4_ * auVar13._0_4_;
  auVar174._4_4_ = auVar9._4_4_ * auVar13._4_4_;
  auVar174._8_4_ = auVar9._8_4_ * auVar13._8_4_;
  auVar174._12_4_ = auVar9._12_4_ * auVar13._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar10);
  auVar9 = vsubps_avx(auVar9,auVar89);
  auVar113._0_4_ = auVar13._0_4_ * auVar9._0_4_;
  auVar113._4_4_ = auVar13._4_4_ * auVar9._4_4_;
  auVar113._8_4_ = auVar13._8_4_ * auVar9._8_4_;
  auVar113._12_4_ = auVar13._12_4_ * auVar9._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar80 + uVar82 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar126);
  auVar146._0_4_ = auVar90._0_4_ * auVar9._0_4_;
  auVar146._4_4_ = auVar90._4_4_ * auVar9._4_4_;
  auVar146._8_4_ = auVar90._8_4_ * auVar9._8_4_;
  auVar146._12_4_ = auVar90._12_4_ * auVar9._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar82 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar14);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar126);
  auVar89._0_4_ = auVar90._0_4_ * auVar9._0_4_;
  auVar89._4_4_ = auVar90._4_4_ * auVar9._4_4_;
  auVar89._8_4_ = auVar90._8_4_ * auVar9._8_4_;
  auVar89._12_4_ = auVar90._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar152,auVar158);
  auVar10 = vpminsd_avx(auVar174,auVar113);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar146,auVar89);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar177._4_4_ = uVar111;
  auVar177._0_4_ = uVar111;
  auVar177._8_4_ = uVar111;
  auVar177._12_4_ = uVar111;
  auVar10 = vmaxps_avx(auVar10,auVar177);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_400._0_4_ = auVar9._0_4_ * 0.99999964;
  local_400._4_4_ = auVar9._4_4_ * 0.99999964;
  local_400._8_4_ = auVar9._8_4_ * 0.99999964;
  local_400._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar152,auVar158);
  auVar10 = vpmaxsd_avx(auVar174,auVar113);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar146,auVar89);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar126._4_4_ = uVar111;
  auVar126._0_4_ = uVar111;
  auVar126._8_4_ = uVar111;
  auVar126._12_4_ = uVar111;
  auVar10 = vminps_avx(auVar10,auVar126);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar90._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar114[4] = PVar6;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar6;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar6;
  auVar114._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar114,_DAT_01f7fcf0);
  auVar9 = vcmpps_avx(local_400,auVar90,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar78 = vmovmskps_avx(auVar9);
  if (uVar78 == 0) {
    bVar77 = false;
  }
  else {
    uVar78 = uVar78 & 0xff;
    local_608 = pre->ray_space + k;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    iVar79 = 1 << ((uint)k & 0x1f);
    auVar93._4_4_ = iVar79;
    auVar93._0_4_ = iVar79;
    auVar93._8_4_ = iVar79;
    auVar93._12_4_ = iVar79;
    auVar93._16_4_ = iVar79;
    auVar93._20_4_ = iVar79;
    auVar93._24_4_ = iVar79;
    auVar93._28_4_ = iVar79;
    auVar135 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar93 = vpand_avx2(auVar93,auVar135);
    local_3e0 = vpcmpeqd_avx2(auVar93,auVar135);
    do {
      lVar15 = 0;
      for (uVar80 = (ulong)uVar78; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        lVar15 = lVar15 + 1;
      }
      local_8c0._4_4_ = *(undefined4 *)(prim + 2);
      local_6c0._4_4_ = *(undefined4 *)(prim + lVar15 * 4 + 6);
      local_580 = (ulong)(uint)local_6c0._4_4_;
      pGVar7 = (context->scene->geometries).items[(uint)local_8c0._4_4_].ptr;
      uVar80 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               local_580 *
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar84 = (long)pGVar7[1].intersectionFilterN * uVar80;
      lVar81 = (long)pGVar7[1].intersectionFilterN * (uVar80 + 1);
      lVar15 = *(long *)&pGVar7[1].time_range.upper;
      local_6f0 = *(undefined1 (*) [16])(lVar15 + lVar84);
      _local_590 = *(undefined1 (*) [16])(lVar15 + lVar81);
      uVar111 = *(undefined4 *)(lVar15 + 0xc + lVar84);
      auVar169._4_4_ = uVar111;
      auVar169._0_4_ = uVar111;
      auVar169._8_4_ = uVar111;
      auVar169._12_4_ = uVar111;
      local_3a0._16_4_ = uVar111;
      local_3a0._0_16_ = auVar169;
      local_3a0._20_4_ = uVar111;
      local_3a0._24_4_ = uVar111;
      local_3a0._28_4_ = uVar111;
      iVar79 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar125 = *(float *)(lVar15 + 0xc + lVar81);
      auVar204._4_4_ = fVar125;
      auVar204._0_4_ = fVar125;
      auVar204._8_4_ = fVar125;
      auVar204._12_4_ = fVar125;
      fStack_3b0 = fVar125;
      _local_3c0 = auVar204;
      fStack_3ac = fVar125;
      fStack_3a8 = fVar125;
      uStack_3a4 = fVar125;
      lVar15 = (long)iVar79 * 0x44;
      auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar115._8_4_ = 0xbeaaaaab;
      auVar115._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar115._12_4_ = 0xbeaaaaab;
      auVar114 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar7[2].intersectionFilterN +
                                   uVar80 * (long)pGVar7[2].pointQueryFunc),local_6f0,auVar115);
      auVar14 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar7[2].intersectionFilterN +
                                 (long)pGVar7[2].pointQueryFunc * (uVar80 + 1)),_local_590,auVar115)
      ;
      auVar11 = vsubps_avx(local_6f0,auVar9);
      uVar111 = auVar11._0_4_;
      auVar127._4_4_ = uVar111;
      auVar127._0_4_ = uVar111;
      auVar127._8_4_ = uVar111;
      auVar127._12_4_ = uVar111;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      aVar4 = (local_608->vx).field_0;
      aVar5 = (local_608->vy).field_0;
      fVar103 = (local_608->vz).field_0.m128[0];
      fVar105 = *(float *)((long)&(local_608->vz).field_0 + 4);
      fVar124 = *(float *)((long)&(local_608->vz).field_0 + 8);
      fVar104 = *(float *)((long)&(local_608->vz).field_0 + 0xc);
      auVar175._0_4_ = fVar103 * auVar11._0_4_;
      auVar175._4_4_ = fVar105 * auVar11._4_4_;
      auVar175._8_4_ = fVar124 * auVar11._8_4_;
      auVar175._12_4_ = fVar104 * auVar11._12_4_;
      auVar10 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar5,auVar10);
      auVar90 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar4,auVar127);
      auVar12 = vinsertps_avx(auVar90,auVar169,0x30);
      auVar11 = vsubps_avx(auVar114,auVar9);
      uVar111 = auVar11._0_4_;
      auVar147._4_4_ = uVar111;
      auVar147._0_4_ = uVar111;
      auVar147._8_4_ = uVar111;
      auVar147._12_4_ = uVar111;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar187._0_4_ = fVar103 * auVar11._0_4_;
      auVar187._4_4_ = fVar105 * auVar11._4_4_;
      auVar187._8_4_ = fVar124 * auVar11._8_4_;
      auVar187._12_4_ = fVar104 * auVar11._12_4_;
      auVar10 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar10);
      auVar89 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar4,auVar147);
      auVar13 = vsubps_avx(auVar14,auVar9);
      auVar10 = vshufps_avx(auVar13,auVar13,0x55);
      auVar11 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar170._0_4_ = fVar103 * auVar11._0_4_;
      auVar170._4_4_ = fVar105 * auVar11._4_4_;
      auVar170._8_4_ = fVar124 * auVar11._8_4_;
      auVar170._12_4_ = fVar104 * auVar11._12_4_;
      auVar11 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar5,auVar10);
      auVar10 = vblendps_avx(auVar89,auVar114,8);
      auVar128._0_4_ = auVar13._0_4_;
      auVar128._4_4_ = auVar128._0_4_;
      auVar128._8_4_ = auVar128._0_4_;
      auVar128._12_4_ = auVar128._0_4_;
      auVar126 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar128);
      auVar13 = vsubps_avx(_local_590,auVar9);
      auVar9 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar195._0_4_ = fVar103 * auVar9._0_4_;
      auVar195._4_4_ = fVar105 * auVar9._4_4_;
      auVar195._8_4_ = fVar124 * auVar9._8_4_;
      auVar195._12_4_ = fVar104 * auVar9._12_4_;
      auVar9 = vshufps_avx(auVar13,auVar13,0x55);
      auVar9 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar9);
      auVar11 = vblendps_avx(auVar126,auVar14,8);
      auVar91._0_4_ = auVar13._0_4_;
      auVar91._4_4_ = auVar91._0_4_;
      auVar91._8_4_ = auVar91._0_4_;
      auVar91._12_4_ = auVar91._0_4_;
      auVar113 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar4,auVar91);
      auVar13 = vinsertps_avx(auVar113,auVar204,0x30);
      auVar9 = vandps_avx(auVar12,local_3f0);
      auVar10 = vandps_avx(auVar10,local_3f0);
      auVar12 = vmaxps_avx(auVar9,auVar10);
      auVar9 = vandps_avx(auVar11,local_3f0);
      auVar10 = vandps_avx(auVar13,local_3f0);
      auVar9 = vmaxps_avx(auVar9,auVar10);
      auVar9 = vmaxps_avx(auVar12,auVar9);
      auVar10 = vmovshdup_avx(auVar9);
      auVar10 = vmaxss_avx(auVar10,auVar9);
      auVar9 = vshufpd_avx(auVar9,auVar9,1);
      auVar9 = vmaxss_avx(auVar9,auVar10);
      auVar10 = vmovshdup_avx(auVar90);
      uVar86 = auVar10._0_8_;
      local_5c0._8_8_ = uVar86;
      local_5c0._0_8_ = uVar86;
      local_5c0._16_8_ = uVar86;
      local_5c0._24_8_ = uVar86;
      auVar10 = vmovshdup_avx(auVar89);
      uVar86 = auVar10._0_8_;
      auVar205._8_8_ = uVar86;
      auVar205._0_8_ = uVar86;
      auVar205._16_8_ = uVar86;
      auVar205._24_8_ = uVar86;
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar15 + 0x908);
      auVar11 = vmovshdup_avx(auVar126);
      uVar86 = auVar11._0_8_;
      auVar189._8_8_ = uVar86;
      auVar189._0_8_ = uVar86;
      auVar189._16_8_ = uVar86;
      auVar189._24_8_ = uVar86;
      auVar11 = vmovshdup_avx(auVar113);
      uVar111 = auVar126._0_4_;
      auVar116._4_4_ = uVar111;
      auVar116._0_4_ = uVar111;
      auVar116._8_4_ = uVar111;
      auVar116._12_4_ = uVar111;
      auVar116._16_4_ = uVar111;
      auVar116._20_4_ = uVar111;
      auVar116._24_4_ = uVar111;
      auVar116._28_4_ = uVar111;
      pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar15 + 0xd8c);
      fVar124 = *(float *)*pauVar1;
      fVar104 = *(float *)(bezier_basis0 + lVar15 + 0xd90);
      fVar106 = *(float *)(bezier_basis0 + lVar15 + 0xd94);
      fVar107 = *(float *)(bezier_basis0 + lVar15 + 0xd98);
      fVar108 = *(float *)(bezier_basis0 + lVar15 + 0xd9c);
      fVar109 = *(float *)(bezier_basis0 + lVar15 + 0xda0);
      fVar110 = *(float *)(bezier_basis0 + lVar15 + 0xda4);
      auVar74 = *(undefined1 (*) [28])*pauVar1;
      fVar194 = auVar113._0_4_;
      auVar148._0_4_ = fVar124 * fVar194;
      auVar148._4_4_ = fVar104 * fVar194;
      auVar148._8_4_ = fVar106 * fVar194;
      auVar148._12_4_ = fVar107 * fVar194;
      auVar148._16_4_ = fVar108 * fVar194;
      auVar148._20_4_ = fVar109 * fVar194;
      auVar148._24_4_ = fVar110 * fVar194;
      auVar148._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar148,auVar93,auVar116);
      fVar103 = auVar11._0_4_;
      auVar135._0_4_ = fVar124 * fVar103;
      fVar105 = auVar11._4_4_;
      auVar135._4_4_ = fVar104 * fVar105;
      auVar135._8_4_ = fVar106 * fVar103;
      auVar135._12_4_ = fVar107 * fVar105;
      auVar135._16_4_ = fVar108 * fVar103;
      auVar135._20_4_ = fVar109 * fVar105;
      auVar135._24_4_ = fVar110 * fVar103;
      auVar135._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar135,auVar93,auVar189);
      auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar15 + 0x484);
      uVar172 = auVar89._0_4_;
      auVar166._4_4_ = uVar172;
      auVar166._0_4_ = uVar172;
      auVar166._8_4_ = uVar172;
      auVar166._12_4_ = uVar172;
      auVar166._16_4_ = uVar172;
      auVar166._20_4_ = uVar172;
      auVar166._24_4_ = uVar172;
      auVar166._28_4_ = uVar172;
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar135,auVar166);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar135,auVar205);
      auVar148 = *(undefined1 (*) [32])(bezier_basis0 + lVar15);
      uVar172 = auVar90._0_4_;
      auVar161._4_4_ = uVar172;
      auVar161._0_4_ = uVar172;
      auVar161._8_4_ = uVar172;
      auVar161._12_4_ = uVar172;
      auVar161._16_4_ = uVar172;
      auVar161._20_4_ = uVar172;
      auVar161._24_4_ = uVar172;
      auVar161._28_4_ = uVar172;
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar148,auVar161);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar148,local_5c0);
      local_4a0 = *(undefined1 (*) [32])(bezier_basis1 + lVar15 + 0x908);
      fVar66 = *(float *)(bezier_basis1 + lVar15 + 0xd8c);
      fVar67 = *(float *)(bezier_basis1 + lVar15 + 0xd90);
      fVar68 = *(float *)(bezier_basis1 + lVar15 + 0xd94);
      fVar69 = *(float *)(bezier_basis1 + lVar15 + 0xd98);
      fVar70 = *(float *)(bezier_basis1 + lVar15 + 0xd9c);
      fVar71 = *(float *)(bezier_basis1 + lVar15 + 0xda0);
      fVar72 = *(float *)(bezier_basis1 + lVar15 + 0xda4);
      auVar102._4_4_ = fVar67 * fVar194;
      auVar102._0_4_ = fVar66 * fVar194;
      auVar102._8_4_ = fVar68 * fVar194;
      auVar102._12_4_ = fVar69 * fVar194;
      auVar102._16_4_ = fVar70 * fVar194;
      auVar102._20_4_ = fVar71 * fVar194;
      auVar102._24_4_ = fVar72 * fVar194;
      auVar102._28_4_ = fVar194;
      auVar13 = vfmadd231ps_fma(auVar102,local_4a0,auVar116);
      auVar121._4_4_ = fVar67 * fVar105;
      auVar121._0_4_ = fVar66 * fVar103;
      auVar121._8_4_ = fVar68 * fVar103;
      auVar121._12_4_ = fVar69 * fVar105;
      auVar121._16_4_ = fVar70 * fVar103;
      auVar121._20_4_ = fVar71 * fVar105;
      auVar121._24_4_ = fVar72 * fVar103;
      auVar121._28_4_ = uVar111;
      auVar88 = vfmadd231ps_fma(auVar121,local_4a0,auVar189);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar15 + 0x484);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,auVar166);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar102,auVar205);
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar15);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,auVar161);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar121,local_5c0);
      auVar94 = ZEXT1632(auVar13);
      _local_440 = ZEXT1632(auVar12);
      auVar101 = vsubps_avx(auVar94,_local_440);
      local_420 = ZEXT1632(auVar88);
      local_460 = ZEXT1632(auVar11);
      local_540 = vsubps_avx(local_420,local_460);
      auVar95._0_4_ = auVar11._0_4_ * auVar101._0_4_;
      auVar95._4_4_ = auVar11._4_4_ * auVar101._4_4_;
      auVar95._8_4_ = auVar11._8_4_ * auVar101._8_4_;
      auVar95._12_4_ = auVar11._12_4_ * auVar101._12_4_;
      auVar95._16_4_ = auVar101._16_4_ * 0.0;
      auVar95._20_4_ = auVar101._20_4_ * 0.0;
      auVar95._24_4_ = auVar101._24_4_ * 0.0;
      auVar95._28_4_ = 0;
      fVar201 = local_540._0_4_;
      auVar117._0_4_ = fVar201 * auVar12._0_4_;
      fVar207 = local_540._4_4_;
      auVar117._4_4_ = fVar207 * auVar12._4_4_;
      fVar208 = local_540._8_4_;
      auVar117._8_4_ = fVar208 * auVar12._8_4_;
      fVar209 = local_540._12_4_;
      auVar117._12_4_ = fVar209 * auVar12._12_4_;
      fVar210 = local_540._16_4_;
      auVar117._16_4_ = fVar210 * 0.0;
      fVar211 = local_540._20_4_;
      auVar117._20_4_ = fVar211 * 0.0;
      fVar212 = local_540._24_4_;
      auVar117._24_4_ = fVar212 * 0.0;
      auVar117._28_4_ = 0;
      auVar95 = vsubps_avx(auVar95,auVar117);
      auVar11 = vpermilps_avx(auVar114,0xff);
      uVar86 = auVar11._0_8_;
      local_80._8_8_ = uVar86;
      local_80._0_8_ = uVar86;
      local_80._16_8_ = uVar86;
      local_80._24_8_ = uVar86;
      auVar12 = vpermilps_avx(auVar14,0xff);
      local_a0._0_8_ = auVar12._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar184._4_4_ = fVar104 * fVar125;
      auVar184._0_4_ = fVar124 * fVar125;
      auVar184._8_4_ = fVar106 * fVar125;
      auVar184._12_4_ = fVar107 * fVar125;
      auVar184._16_4_ = fVar108 * fVar125;
      auVar184._20_4_ = fVar109 * fVar125;
      auVar184._24_4_ = fVar110 * fVar125;
      auVar184._28_4_ = *(undefined4 *)(bezier_basis0 + lVar15 + 0xda8);
      auVar12 = vfmadd231ps_fma(auVar184,local_a0,auVar93);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar135,local_80);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar148,local_3a0);
      auVar179._4_4_ = fVar67 * fVar125;
      auVar179._0_4_ = fVar66 * fVar125;
      auVar179._8_4_ = fVar68 * fVar125;
      auVar179._12_4_ = fVar69 * fVar125;
      auVar179._16_4_ = fVar70 * fVar125;
      auVar179._20_4_ = fVar71 * fVar125;
      auVar179._24_4_ = fVar72 * fVar125;
      auVar179._28_4_ = auVar148._28_4_;
      auVar13 = vfmadd231ps_fma(auVar179,local_4a0,local_a0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,local_80);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,local_3a0);
      auVar140._4_4_ = fVar207 * fVar207;
      auVar140._0_4_ = fVar201 * fVar201;
      auVar140._8_4_ = fVar208 * fVar208;
      auVar140._12_4_ = fVar209 * fVar209;
      auVar140._16_4_ = fVar210 * fVar210;
      auVar140._20_4_ = fVar211 * fVar211;
      auVar140._24_4_ = fVar212 * fVar212;
      auVar140._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar140,auVar101,auVar101);
      auVar184 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
      auVar180._4_4_ = auVar184._4_4_ * auVar184._4_4_ * auVar11._4_4_;
      auVar180._0_4_ = auVar184._0_4_ * auVar184._0_4_ * auVar11._0_4_;
      auVar180._8_4_ = auVar184._8_4_ * auVar184._8_4_ * auVar11._8_4_;
      auVar180._12_4_ = auVar184._12_4_ * auVar184._12_4_ * auVar11._12_4_;
      auVar180._16_4_ = auVar184._16_4_ * auVar184._16_4_ * 0.0;
      auVar180._20_4_ = auVar184._20_4_ * auVar184._20_4_ * 0.0;
      auVar180._24_4_ = auVar184._24_4_ * auVar184._24_4_ * 0.0;
      auVar180._28_4_ = auVar184._28_4_;
      auVar196._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar196._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar196._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar196._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar196._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar196._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar196._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar196._28_4_ = 0;
      auVar184 = vcmpps_avx(auVar196,auVar180,2);
      auVar145 = ZEXT3264(auVar184);
      fVar125 = auVar9._0_4_ * 4.7683716e-07;
      auVar96._0_4_ = (float)iVar79;
      uStack_55c = auVar113._4_4_;
      uStack_558 = auVar113._8_4_;
      uStack_554 = auVar113._12_4_;
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar96._16_4_ = auVar96._0_4_;
      auVar96._20_4_ = auVar96._0_4_;
      auVar96._24_4_ = auVar96._0_4_;
      auVar96._28_4_ = auVar96._0_4_;
      auVar179 = vcmpps_avx(_DAT_01faff40,auVar96,1);
      auVar9 = vpermilps_avx(auVar90,0xaa);
      uVar86 = auVar9._0_8_;
      local_6a0._8_8_ = uVar86;
      local_6a0._0_8_ = uVar86;
      local_6a0._16_8_ = uVar86;
      local_6a0._24_8_ = uVar86;
      auVar9 = vpermilps_avx(auVar89,0xaa);
      uVar86 = auVar9._0_8_;
      local_520._8_8_ = uVar86;
      local_520._0_8_ = uVar86;
      local_520._16_8_ = uVar86;
      local_520._24_8_ = uVar86;
      auVar9 = vpermilps_avx(auVar126,0xaa);
      uVar86 = auVar9._0_8_;
      local_c0._8_8_ = uVar86;
      local_c0._0_8_ = uVar86;
      local_c0._16_8_ = uVar86;
      local_c0._24_8_ = uVar86;
      auVar9 = vshufps_avx(auVar113,auVar113,0xaa);
      local_e0 = auVar9._0_8_;
      auVar140 = auVar179 & auVar184;
      uVar83 = *(uint *)(ray + k * 4 + 0x60);
      local_740._0_16_ = ZEXT416(uVar83);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      local_790 = auVar114._0_8_;
      uStack_788 = auVar114._8_8_;
      auVar180 = local_680;
      local_560 = auVar96._0_4_;
      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar140 >> 0x7f,0) == '\0') &&
            (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar140 >> 0xbf,0) == '\0') &&
          (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar140[0x1f]) {
LAB_015f4f2d:
        auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(fVar194,
                                                  CONCAT412(fVar194,CONCAT48(fVar194,CONCAT44(
                                                  fVar194,fVar194))))))));
LAB_015f4f3f:
        bVar77 = false;
        auVar102 = local_660;
      }
      else {
        _local_4c0 = vandps_avx(auVar184,auVar179);
        fVar124 = auVar9._0_4_;
        fVar104 = auVar9._4_4_;
        auVar142._4_4_ = fVar67 * fVar104;
        auVar142._0_4_ = fVar66 * fVar124;
        auVar142._8_4_ = fVar68 * fVar124;
        auVar142._12_4_ = fVar69 * fVar104;
        auVar142._16_4_ = fVar70 * fVar124;
        auVar142._20_4_ = fVar71 * fVar104;
        auVar142._24_4_ = fVar72 * fVar124;
        auVar142._28_4_ = local_4c0._28_4_;
        auVar9 = vfmadd213ps_fma(local_4a0,local_c0,auVar142);
        auVar9 = vfmadd213ps_fma(auVar102,local_520,ZEXT1632(auVar9));
        auVar9 = vfmadd213ps_fma(auVar121,local_6a0,ZEXT1632(auVar9));
        local_480._0_4_ = auVar74._0_4_;
        local_480._4_4_ = auVar74._4_4_;
        fStack_478 = auVar74._8_4_;
        fStack_474 = auVar74._12_4_;
        fStack_470 = auVar74._16_4_;
        fStack_46c = auVar74._20_4_;
        fStack_468 = auVar74._24_4_;
        auVar97._0_4_ = fVar124 * (float)local_480._0_4_;
        auVar97._4_4_ = fVar104 * (float)local_480._4_4_;
        auVar97._8_4_ = fVar124 * fStack_478;
        auVar97._12_4_ = fVar104 * fStack_474;
        auVar97._16_4_ = fVar124 * fStack_470;
        auVar97._20_4_ = fVar104 * fStack_46c;
        auVar97._24_4_ = fVar124 * fStack_468;
        auVar97._28_4_ = 0;
        auVar11 = vfmadd213ps_fma(auVar93,local_c0,auVar97);
        auVar11 = vfmadd213ps_fma(auVar135,local_520,ZEXT1632(auVar11));
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar15 + 0x1210);
        auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar15 + 0x1694);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar15 + 0x1b18);
        fVar106 = *(float *)(bezier_basis0 + lVar15 + 0x1f9c);
        fVar107 = *(float *)(bezier_basis0 + lVar15 + 0x1fa0);
        fVar108 = *(float *)(bezier_basis0 + lVar15 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis0 + lVar15 + 0x1fa8);
        fVar110 = *(float *)(bezier_basis0 + lVar15 + 0x1fac);
        fVar66 = *(float *)(bezier_basis0 + lVar15 + 0x1fb0);
        fVar67 = *(float *)(bezier_basis0 + lVar15 + 0x1fb4);
        auVar200._4_4_ = fVar194 * fVar107;
        auVar200._0_4_ = fVar194 * fVar106;
        auVar200._8_4_ = fVar194 * fVar108;
        auVar200._12_4_ = fVar194 * fVar109;
        auVar200._16_4_ = fVar194 * fVar110;
        auVar200._20_4_ = fVar194 * fVar66;
        auVar200._24_4_ = fVar194 * fVar67;
        auVar200._28_4_ = auVar95._28_4_;
        auVar178._0_4_ = fVar106 * fVar103;
        auVar178._4_4_ = fVar107 * fVar105;
        auVar178._8_4_ = fVar108 * fVar103;
        auVar178._12_4_ = fVar109 * fVar105;
        auVar178._16_4_ = fVar110 * fVar103;
        auVar178._20_4_ = fVar66 * fVar105;
        auVar178._24_4_ = fVar67 * fVar103;
        auVar178._28_4_ = 0;
        auVar16._4_4_ = fVar107 * fVar104;
        auVar16._0_4_ = fVar106 * fVar124;
        auVar16._8_4_ = fVar108 * fVar124;
        auVar16._12_4_ = fVar109 * fVar104;
        auVar16._16_4_ = fVar110 * fVar124;
        auVar16._20_4_ = fVar66 * fVar104;
        auVar16._24_4_ = fVar67 * fVar124;
        auVar16._28_4_ = *(undefined4 *)(bezier_basis1 + lVar15 + 0xda8);
        auVar90 = vfmadd231ps_fma(auVar200,auVar102,auVar116);
        auVar89 = vfmadd231ps_fma(auVar178,auVar102,auVar189);
        auVar126 = vfmadd231ps_fma(auVar16,local_c0,auVar102);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar135,auVar166);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar135,auVar205);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_520,auVar135);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar93,auVar161);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar93,local_5c0);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar93,local_6a0);
        fVar106 = *(float *)(bezier_basis1 + lVar15 + 0x1f9c);
        fVar107 = *(float *)(bezier_basis1 + lVar15 + 0x1fa0);
        fVar108 = *(float *)(bezier_basis1 + lVar15 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis1 + lVar15 + 0x1fa8);
        fVar110 = *(float *)(bezier_basis1 + lVar15 + 0x1fac);
        fVar66 = *(float *)(bezier_basis1 + lVar15 + 0x1fb0);
        fVar67 = *(float *)(bezier_basis1 + lVar15 + 0x1fb4);
        auVar190._0_4_ = fVar194 * fVar106;
        auVar190._4_4_ = fVar194 * fVar107;
        auVar190._8_4_ = fVar194 * fVar108;
        auVar190._12_4_ = fVar194 * fVar109;
        auVar190._16_4_ = fVar194 * fVar110;
        auVar190._20_4_ = fVar194 * fVar66;
        auVar190._24_4_ = fVar194 * fVar67;
        auVar190._28_4_ = 0;
        auVar17._4_4_ = fVar105 * fVar107;
        auVar17._0_4_ = fVar103 * fVar106;
        auVar17._8_4_ = fVar103 * fVar108;
        auVar17._12_4_ = fVar105 * fVar109;
        auVar17._16_4_ = fVar103 * fVar110;
        auVar17._20_4_ = fVar105 * fVar66;
        auVar17._24_4_ = fVar103 * fVar67;
        auVar17._28_4_ = fVar194;
        auVar18._4_4_ = fVar104 * fVar107;
        auVar18._0_4_ = fVar124 * fVar106;
        auVar18._8_4_ = fVar124 * fVar108;
        auVar18._12_4_ = fVar104 * fVar109;
        auVar18._16_4_ = fVar124 * fVar110;
        auVar18._20_4_ = fVar104 * fVar66;
        auVar18._24_4_ = fVar124 * fVar67;
        auVar18._28_4_ = *(undefined4 *)(bezier_basis0 + lVar15 + 0x1fb8);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar15 + 0x1b18);
        auVar113 = vfmadd231ps_fma(auVar190,auVar93,auVar116);
        auVar88 = vfmadd231ps_fma(auVar17,auVar93,auVar189);
        auVar146 = vfmadd231ps_fma(auVar18,local_c0,auVar93);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar15 + 0x1694);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar93,auVar166);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar93,auVar205);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar93,local_520);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar15 + 0x1210);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar93,auVar161);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar93,local_5c0);
        auVar118._8_4_ = 0x7fffffff;
        auVar118._0_8_ = 0x7fffffff7fffffff;
        auVar118._12_4_ = 0x7fffffff;
        auVar118._16_4_ = 0x7fffffff;
        auVar118._20_4_ = 0x7fffffff;
        auVar118._24_4_ = 0x7fffffff;
        auVar118._28_4_ = 0x7fffffff;
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),local_6a0,auVar93);
        auVar93 = vandps_avx(ZEXT1632(auVar90),auVar118);
        auVar135 = vandps_avx(ZEXT1632(auVar89),auVar118);
        auVar135 = vmaxps_avx(auVar93,auVar135);
        auVar93 = vandps_avx(ZEXT1632(auVar126),auVar118);
        auVar93 = vmaxps_avx(auVar135,auVar93);
        auVar136._4_4_ = fVar125;
        auVar136._0_4_ = fVar125;
        auVar136._8_4_ = fVar125;
        auVar136._12_4_ = fVar125;
        auVar136._16_4_ = fVar125;
        auVar136._20_4_ = fVar125;
        auVar136._24_4_ = fVar125;
        auVar136._28_4_ = fVar125;
        auVar93 = vcmpps_avx(auVar93,auVar136,1);
        auVar102 = vblendvps_avx(ZEXT1632(auVar90),auVar101,auVar93);
        auVar121 = vblendvps_avx(ZEXT1632(auVar89),local_540,auVar93);
        auVar93 = vandps_avx(ZEXT1632(auVar113),auVar118);
        auVar135 = vandps_avx(ZEXT1632(auVar88),auVar118);
        auVar135 = vmaxps_avx(auVar93,auVar135);
        auVar93 = vandps_avx(ZEXT1632(auVar146),auVar118);
        auVar93 = vmaxps_avx(auVar135,auVar93);
        auVar184 = vcmpps_avx(auVar93,auVar136,1);
        auVar93 = vblendvps_avx(ZEXT1632(auVar113),auVar101,auVar184);
        auVar135 = vblendvps_avx(ZEXT1632(auVar88),local_540,auVar184);
        auVar11 = vfmadd213ps_fma(auVar148,local_6a0,ZEXT1632(auVar11));
        auVar90 = vfmadd213ps_fma(auVar102,auVar102,ZEXT832(0) << 0x20);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar121,auVar121);
        auVar148 = vrsqrtps_avx(ZEXT1632(auVar90));
        fVar124 = auVar148._0_4_;
        fVar104 = auVar148._4_4_;
        fVar106 = auVar148._8_4_;
        fVar107 = auVar148._12_4_;
        fVar108 = auVar148._16_4_;
        fVar109 = auVar148._20_4_;
        fVar110 = auVar148._24_4_;
        auVar101._4_4_ = fVar104 * fVar104 * fVar104 * auVar90._4_4_ * -0.5;
        auVar101._0_4_ = fVar124 * fVar124 * fVar124 * auVar90._0_4_ * -0.5;
        auVar101._8_4_ = fVar106 * fVar106 * fVar106 * auVar90._8_4_ * -0.5;
        auVar101._12_4_ = fVar107 * fVar107 * fVar107 * auVar90._12_4_ * -0.5;
        auVar101._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar101._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar101._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar101._28_4_ = 0;
        auVar191._8_4_ = 0x3fc00000;
        auVar191._0_8_ = 0x3fc000003fc00000;
        auVar191._12_4_ = 0x3fc00000;
        auVar191._16_4_ = 0x3fc00000;
        auVar191._20_4_ = 0x3fc00000;
        auVar191._24_4_ = 0x3fc00000;
        auVar191._28_4_ = 0x3fc00000;
        auVar90 = vfmadd231ps_fma(auVar101,auVar191,auVar148);
        fVar124 = auVar90._0_4_;
        fVar104 = auVar90._4_4_;
        auVar19._4_4_ = auVar121._4_4_ * fVar104;
        auVar19._0_4_ = auVar121._0_4_ * fVar124;
        fVar106 = auVar90._8_4_;
        auVar19._8_4_ = auVar121._8_4_ * fVar106;
        fVar107 = auVar90._12_4_;
        auVar19._12_4_ = auVar121._12_4_ * fVar107;
        auVar19._16_4_ = auVar121._16_4_ * 0.0;
        auVar19._20_4_ = auVar121._20_4_ * 0.0;
        auVar19._24_4_ = auVar121._24_4_ * 0.0;
        auVar19._28_4_ = auVar148._28_4_;
        auVar20._4_4_ = -auVar102._4_4_ * fVar104;
        auVar20._0_4_ = -auVar102._0_4_ * fVar124;
        auVar20._8_4_ = -auVar102._8_4_ * fVar106;
        auVar20._12_4_ = -auVar102._12_4_ * fVar107;
        auVar20._16_4_ = -auVar102._16_4_ * 0.0;
        auVar20._20_4_ = -auVar102._20_4_ * 0.0;
        auVar20._24_4_ = -auVar102._24_4_ * 0.0;
        auVar20._28_4_ = 0x80000000;
        auVar90 = vfmadd213ps_fma(auVar93,auVar93,ZEXT832(0) << 0x20);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar135,auVar135);
        auVar148 = vrsqrtps_avx(ZEXT1632(auVar90));
        auVar21._28_4_ = auVar184._28_4_;
        auVar21._0_28_ =
             ZEXT1628(CONCAT412(fVar107 * 0.0,
                                CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar124 * 0.0))));
        fVar124 = auVar148._0_4_;
        fVar104 = auVar148._4_4_;
        fVar106 = auVar148._8_4_;
        fVar107 = auVar148._12_4_;
        fVar108 = auVar148._16_4_;
        fVar109 = auVar148._20_4_;
        fVar110 = auVar148._24_4_;
        auVar22._4_4_ = fVar104 * fVar104 * fVar104 * auVar90._4_4_ * -0.5;
        auVar22._0_4_ = fVar124 * fVar124 * fVar124 * auVar90._0_4_ * -0.5;
        auVar22._8_4_ = fVar106 * fVar106 * fVar106 * auVar90._8_4_ * -0.5;
        auVar22._12_4_ = fVar107 * fVar107 * fVar107 * auVar90._12_4_ * -0.5;
        auVar22._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar22._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar22._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar22._28_4_ = 0;
        auVar90 = vfmadd231ps_fma(auVar22,auVar191,auVar148);
        fVar124 = auVar90._0_4_;
        fVar104 = auVar90._4_4_;
        auVar23._4_4_ = auVar135._4_4_ * fVar104;
        auVar23._0_4_ = auVar135._0_4_ * fVar124;
        fVar106 = auVar90._8_4_;
        auVar23._8_4_ = auVar135._8_4_ * fVar106;
        fVar107 = auVar90._12_4_;
        auVar23._12_4_ = auVar135._12_4_ * fVar107;
        auVar23._16_4_ = auVar135._16_4_ * 0.0;
        auVar23._20_4_ = auVar135._20_4_ * 0.0;
        auVar23._24_4_ = auVar135._24_4_ * 0.0;
        auVar23._28_4_ = auVar135._28_4_;
        auVar24._4_4_ = fVar104 * -auVar93._4_4_;
        auVar24._0_4_ = fVar124 * -auVar93._0_4_;
        auVar24._8_4_ = fVar106 * -auVar93._8_4_;
        auVar24._12_4_ = fVar107 * -auVar93._12_4_;
        auVar24._16_4_ = -auVar93._16_4_ * 0.0;
        auVar24._20_4_ = -auVar93._20_4_ * 0.0;
        auVar24._24_4_ = -auVar93._24_4_ * 0.0;
        auVar24._28_4_ = auVar102._28_4_ ^ 0x80000000;
        auVar25._28_4_ = auVar148._28_4_;
        auVar25._0_28_ =
             ZEXT1628(CONCAT412(fVar107 * 0.0,
                                CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar124 * 0.0))));
        auVar90 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar12),_local_440);
        auVar93 = ZEXT1632(auVar12);
        auVar89 = vfmadd213ps_fma(auVar20,auVar93,local_460);
        auVar126 = vfmadd213ps_fma(auVar21,auVar93,ZEXT1632(auVar11));
        local_5e0 = ZEXT1632(auVar126);
        auVar88 = vfnmadd213ps_fma(auVar19,auVar93,_local_440);
        auVar126 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar13),auVar94);
        auVar146 = vfnmadd213ps_fma(auVar20,auVar93,local_460);
        auVar93 = ZEXT1632(auVar13);
        auVar113 = vfmadd213ps_fma(auVar24,auVar93,local_420);
        auVar200 = ZEXT1632(auVar12);
        auVar112 = vfnmadd231ps_fma(ZEXT1632(auVar11),auVar200,auVar21);
        auVar11 = vfmadd213ps_fma(auVar25,auVar93,ZEXT1632(auVar9));
        auVar152 = vfnmadd213ps_fma(auVar23,auVar93,auVar94);
        auVar87 = vfnmadd213ps_fma(auVar24,auVar93,local_420);
        auVar151 = vfnmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar13),auVar25);
        auVar93 = vsubps_avx(ZEXT1632(auVar113),ZEXT1632(auVar146));
        auVar135 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar112));
        auVar94._4_4_ = auVar112._4_4_ * auVar93._4_4_;
        auVar94._0_4_ = auVar112._0_4_ * auVar93._0_4_;
        auVar94._8_4_ = auVar112._8_4_ * auVar93._8_4_;
        auVar94._12_4_ = auVar112._12_4_ * auVar93._12_4_;
        auVar94._16_4_ = auVar93._16_4_ * 0.0;
        auVar94._20_4_ = auVar93._20_4_ * 0.0;
        auVar94._24_4_ = auVar93._24_4_ * 0.0;
        auVar94._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar146),auVar135);
        auVar26._4_4_ = auVar88._4_4_ * auVar135._4_4_;
        auVar26._0_4_ = auVar88._0_4_ * auVar135._0_4_;
        auVar26._8_4_ = auVar88._8_4_ * auVar135._8_4_;
        auVar26._12_4_ = auVar88._12_4_ * auVar135._12_4_;
        auVar26._16_4_ = auVar135._16_4_ * 0.0;
        auVar26._20_4_ = auVar135._20_4_ * 0.0;
        auVar26._24_4_ = auVar135._24_4_ * 0.0;
        auVar26._28_4_ = auVar135._28_4_;
        auVar179 = ZEXT1632(auVar88);
        auVar135 = vsubps_avx(ZEXT1632(auVar126),auVar179);
        auVar9 = vfmsub231ps_fma(auVar26,ZEXT1632(auVar112),auVar135);
        auVar27._4_4_ = auVar146._4_4_ * auVar135._4_4_;
        auVar27._0_4_ = auVar146._0_4_ * auVar135._0_4_;
        auVar27._8_4_ = auVar146._8_4_ * auVar135._8_4_;
        auVar27._12_4_ = auVar146._12_4_ * auVar135._12_4_;
        auVar27._16_4_ = auVar135._16_4_ * 0.0;
        auVar27._20_4_ = auVar135._20_4_ * 0.0;
        auVar27._24_4_ = auVar135._24_4_ * 0.0;
        auVar27._28_4_ = auVar135._28_4_;
        auVar88 = vfmsub231ps_fma(auVar27,auVar179,auVar93);
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar93,ZEXT1632(auVar9));
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar93,ZEXT1632(auVar12));
        auVar140 = vcmpps_avx(ZEXT1632(auVar9),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar93 = vblendvps_avx(ZEXT1632(auVar152),ZEXT1632(auVar90),auVar140);
        auVar135 = vblendvps_avx(ZEXT1632(auVar87),ZEXT1632(auVar89),auVar140);
        auVar148 = vblendvps_avx(ZEXT1632(auVar151),local_5e0,auVar140);
        auVar102 = vblendvps_avx(auVar179,ZEXT1632(auVar126),auVar140);
        auVar121 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar113),auVar140);
        auVar184 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar11),auVar140);
        auVar179 = vblendvps_avx(ZEXT1632(auVar126),auVar179,auVar140);
        auVar101 = vblendvps_avx(ZEXT1632(auVar113),ZEXT1632(auVar146),auVar140);
        auVar9 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar95 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar112),auVar140);
        auVar180 = vsubps_avx(auVar179,auVar93);
        auVar101 = vsubps_avx(auVar101,auVar135);
        auVar196 = vsubps_avx(auVar95,auVar148);
        auVar94 = vsubps_avx(auVar93,auVar102);
        auVar117 = vsubps_avx(auVar135,auVar121);
        auVar142 = vsubps_avx(auVar148,auVar184);
        auVar28._4_4_ = auVar196._4_4_ * auVar93._4_4_;
        auVar28._0_4_ = auVar196._0_4_ * auVar93._0_4_;
        auVar28._8_4_ = auVar196._8_4_ * auVar93._8_4_;
        auVar28._12_4_ = auVar196._12_4_ * auVar93._12_4_;
        auVar28._16_4_ = auVar196._16_4_ * auVar93._16_4_;
        auVar28._20_4_ = auVar196._20_4_ * auVar93._20_4_;
        auVar28._24_4_ = auVar196._24_4_ * auVar93._24_4_;
        auVar28._28_4_ = auVar95._28_4_;
        auVar11 = vfmsub231ps_fma(auVar28,auVar148,auVar180);
        auVar29._4_4_ = auVar180._4_4_ * auVar135._4_4_;
        auVar29._0_4_ = auVar180._0_4_ * auVar135._0_4_;
        auVar29._8_4_ = auVar180._8_4_ * auVar135._8_4_;
        auVar29._12_4_ = auVar180._12_4_ * auVar135._12_4_;
        auVar29._16_4_ = auVar180._16_4_ * auVar135._16_4_;
        auVar29._20_4_ = auVar180._20_4_ * auVar135._20_4_;
        auVar29._24_4_ = auVar180._24_4_ * auVar135._24_4_;
        auVar29._28_4_ = auVar179._28_4_;
        auVar12 = vfmsub231ps_fma(auVar29,auVar93,auVar101);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar98._0_4_ = auVar101._0_4_ * auVar148._0_4_;
        auVar98._4_4_ = auVar101._4_4_ * auVar148._4_4_;
        auVar98._8_4_ = auVar101._8_4_ * auVar148._8_4_;
        auVar98._12_4_ = auVar101._12_4_ * auVar148._12_4_;
        auVar98._16_4_ = auVar101._16_4_ * auVar148._16_4_;
        auVar98._20_4_ = auVar101._20_4_ * auVar148._20_4_;
        auVar98._24_4_ = auVar101._24_4_ * auVar148._24_4_;
        auVar98._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar98,auVar135,auVar196);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar145 = ZEXT1664(auVar12);
        auVar99._0_4_ = auVar142._0_4_ * auVar102._0_4_;
        auVar99._4_4_ = auVar142._4_4_ * auVar102._4_4_;
        auVar99._8_4_ = auVar142._8_4_ * auVar102._8_4_;
        auVar99._12_4_ = auVar142._12_4_ * auVar102._12_4_;
        auVar99._16_4_ = auVar142._16_4_ * auVar102._16_4_;
        auVar99._20_4_ = auVar142._20_4_ * auVar102._20_4_;
        auVar99._24_4_ = auVar142._24_4_ * auVar102._24_4_;
        auVar99._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar99,auVar94,auVar184);
        auVar30._4_4_ = auVar117._4_4_ * auVar184._4_4_;
        auVar30._0_4_ = auVar117._0_4_ * auVar184._0_4_;
        auVar30._8_4_ = auVar117._8_4_ * auVar184._8_4_;
        auVar30._12_4_ = auVar117._12_4_ * auVar184._12_4_;
        auVar30._16_4_ = auVar117._16_4_ * auVar184._16_4_;
        auVar30._20_4_ = auVar117._20_4_ * auVar184._20_4_;
        auVar30._24_4_ = auVar117._24_4_ * auVar184._24_4_;
        auVar30._28_4_ = auVar184._28_4_;
        auVar90 = vfmsub231ps_fma(auVar30,auVar121,auVar142);
        auVar31._4_4_ = auVar94._4_4_ * auVar121._4_4_;
        auVar31._0_4_ = auVar94._0_4_ * auVar121._0_4_;
        auVar31._8_4_ = auVar94._8_4_ * auVar121._8_4_;
        auVar31._12_4_ = auVar94._12_4_ * auVar121._12_4_;
        auVar31._16_4_ = auVar94._16_4_ * auVar121._16_4_;
        auVar31._20_4_ = auVar94._20_4_ * auVar121._20_4_;
        auVar31._24_4_ = auVar94._24_4_ * auVar121._24_4_;
        auVar31._28_4_ = auVar121._28_4_;
        auVar89 = vfmsub231ps_fma(auVar31,auVar117,auVar102);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar90));
        auVar102 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar90));
        auVar102 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,2);
        auVar11 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
        auVar9 = vpand_avx(auVar11,auVar9);
        auVar102 = vpmovsxwd_avx2(auVar9);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0x7f,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0xbf,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar102[0x1f]) {
          auVar185 = ZEXT864(0) << 0x20;
LAB_015f639f:
          auVar171 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar193 = ZEXT3264(local_660);
          auVar199 = ZEXT3264(local_680);
        }
        else {
          auVar32._4_4_ = auVar101._4_4_ * auVar142._4_4_;
          auVar32._0_4_ = auVar101._0_4_ * auVar142._0_4_;
          auVar32._8_4_ = auVar101._8_4_ * auVar142._8_4_;
          auVar32._12_4_ = auVar101._12_4_ * auVar142._12_4_;
          auVar32._16_4_ = auVar101._16_4_ * auVar142._16_4_;
          auVar32._20_4_ = auVar101._20_4_ * auVar142._20_4_;
          auVar32._24_4_ = auVar101._24_4_ * auVar142._24_4_;
          auVar32._28_4_ = auVar102._28_4_;
          auVar113 = vfmsub231ps_fma(auVar32,auVar117,auVar196);
          auVar119._0_4_ = auVar94._0_4_ * auVar196._0_4_;
          auVar119._4_4_ = auVar94._4_4_ * auVar196._4_4_;
          auVar119._8_4_ = auVar94._8_4_ * auVar196._8_4_;
          auVar119._12_4_ = auVar94._12_4_ * auVar196._12_4_;
          auVar119._16_4_ = auVar94._16_4_ * auVar196._16_4_;
          auVar119._20_4_ = auVar94._20_4_ * auVar196._20_4_;
          auVar119._24_4_ = auVar94._24_4_ * auVar196._24_4_;
          auVar119._28_4_ = 0;
          auVar126 = vfmsub231ps_fma(auVar119,auVar180,auVar142);
          auVar33._4_4_ = auVar180._4_4_ * auVar117._4_4_;
          auVar33._0_4_ = auVar180._0_4_ * auVar117._0_4_;
          auVar33._8_4_ = auVar180._8_4_ * auVar117._8_4_;
          auVar33._12_4_ = auVar180._12_4_ * auVar117._12_4_;
          auVar33._16_4_ = auVar180._16_4_ * auVar117._16_4_;
          auVar33._20_4_ = auVar180._20_4_ * auVar117._20_4_;
          auVar33._24_4_ = auVar180._24_4_ * auVar117._24_4_;
          auVar33._28_4_ = auVar180._28_4_;
          auVar88 = vfmsub231ps_fma(auVar33,auVar94,auVar101);
          auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar126),ZEXT1632(auVar88));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar113),_DAT_01faff00);
          auVar102 = vrcpps_avx(ZEXT1632(auVar89));
          auVar192._8_4_ = 0x3f800000;
          auVar192._0_8_ = 0x3f8000003f800000;
          auVar192._12_4_ = 0x3f800000;
          auVar192._16_4_ = 0x3f800000;
          auVar192._20_4_ = 0x3f800000;
          auVar192._24_4_ = 0x3f800000;
          auVar192._28_4_ = 0x3f800000;
          auVar11 = vfnmadd213ps_fma(auVar102,ZEXT1632(auVar89),auVar192);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar102,auVar102);
          auVar162._0_4_ = auVar148._0_4_ * auVar88._0_4_;
          auVar162._4_4_ = auVar148._4_4_ * auVar88._4_4_;
          auVar162._8_4_ = auVar148._8_4_ * auVar88._8_4_;
          auVar162._12_4_ = auVar148._12_4_ * auVar88._12_4_;
          auVar162._16_4_ = auVar148._16_4_ * 0.0;
          auVar162._20_4_ = auVar148._20_4_ * 0.0;
          auVar162._24_4_ = auVar148._24_4_ * 0.0;
          auVar162._28_4_ = 0;
          auVar126 = vfmadd231ps_fma(auVar162,auVar135,ZEXT1632(auVar126));
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT1632(auVar113),auVar93);
          fVar124 = auVar11._0_4_;
          fVar104 = auVar11._4_4_;
          fVar106 = auVar11._8_4_;
          fVar107 = auVar11._12_4_;
          auVar148 = ZEXT1632(CONCAT412(fVar107 * auVar126._12_4_,
                                        CONCAT48(fVar106 * auVar126._8_4_,
                                                 CONCAT44(fVar104 * auVar126._4_4_,
                                                          fVar124 * auVar126._0_4_))));
          auVar100._4_4_ = uVar83;
          auVar100._0_4_ = uVar83;
          auVar100._8_4_ = uVar83;
          auVar100._12_4_ = uVar83;
          auVar100._16_4_ = uVar83;
          auVar100._20_4_ = uVar83;
          auVar100._24_4_ = uVar83;
          auVar100._28_4_ = uVar83;
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar120._4_4_ = uVar111;
          auVar120._0_4_ = uVar111;
          auVar120._8_4_ = uVar111;
          auVar120._12_4_ = uVar111;
          auVar120._16_4_ = uVar111;
          auVar120._20_4_ = uVar111;
          auVar120._24_4_ = uVar111;
          auVar120._28_4_ = uVar111;
          auVar93 = vcmpps_avx(auVar100,auVar148,2);
          auVar135 = vcmpps_avx(auVar148,auVar120,2);
          auVar93 = vandps_avx(auVar135,auVar93);
          auVar11 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
          auVar9 = vpand_avx(auVar9,auVar11);
          auVar93 = vpmovsxwd_avx2(auVar9);
          auVar185 = ZEXT864(0) << 0x20;
          if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar93 >> 0x7f,0) == '\0') &&
                (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar93 >> 0xbf,0) == '\0') &&
              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar93[0x1f]) goto LAB_015f639f;
          auVar93 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar89),4);
          auVar11 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
          auVar9 = vpand_avx(auVar9,auVar11);
          auVar93 = vpmovsxwd_avx2(auVar9);
          auVar171 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar193 = ZEXT3264(local_660);
          auVar199 = ZEXT3264(local_680);
          if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar93 >> 0x7f,0) != '\0') ||
                (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar93 >> 0xbf,0) != '\0') ||
              (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar93[0x1f] < '\0') {
            auVar102 = ZEXT1632(CONCAT412(fVar107 * auVar12._12_4_,
                                          CONCAT48(fVar106 * auVar12._8_4_,
                                                   CONCAT44(fVar104 * auVar12._4_4_,
                                                            fVar124 * auVar12._0_4_))));
            auVar121 = ZEXT1632(CONCAT412(fVar107 * auVar90._12_4_,
                                          CONCAT48(fVar106 * auVar90._8_4_,
                                                   CONCAT44(fVar104 * auVar90._4_4_,
                                                            fVar124 * auVar90._0_4_))));
            auVar155._8_4_ = 0x3f800000;
            auVar155._0_8_ = 0x3f8000003f800000;
            auVar155._12_4_ = 0x3f800000;
            auVar155._16_4_ = 0x3f800000;
            auVar155._20_4_ = 0x3f800000;
            auVar155._24_4_ = 0x3f800000;
            auVar155._28_4_ = 0x3f800000;
            auVar135 = vsubps_avx(auVar155,auVar102);
            auVar145 = ZEXT3264(auVar135);
            auVar135 = vblendvps_avx(auVar135,auVar102,auVar140);
            auVar193 = ZEXT3264(auVar135);
            auVar135 = vsubps_avx(auVar155,auVar121);
            local_4e0 = vblendvps_avx(auVar135,auVar121,auVar140);
            auVar171 = ZEXT3264(auVar93);
            auVar199 = ZEXT3264(auVar148);
          }
        }
        local_660 = auVar193._0_32_;
        auVar180 = auVar199._0_32_;
        auVar93 = auVar171._0_32_;
        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar93 >> 0x7f,0) == '\0') &&
              (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar93 >> 0xbf,0) == '\0') &&
            (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar171[0x1f]) goto LAB_015f4f2d;
        auVar135 = vsubps_avx(ZEXT1632(auVar13),auVar200);
        auVar9 = vfmadd213ps_fma(auVar135,local_660,auVar200);
        fVar124 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar34._4_4_ = (auVar9._4_4_ + auVar9._4_4_) * fVar124;
        auVar34._0_4_ = (auVar9._0_4_ + auVar9._0_4_) * fVar124;
        auVar34._8_4_ = (auVar9._8_4_ + auVar9._8_4_) * fVar124;
        auVar34._12_4_ = (auVar9._12_4_ + auVar9._12_4_) * fVar124;
        auVar34._16_4_ = fVar124 * 0.0;
        auVar34._20_4_ = fVar124 * 0.0;
        auVar34._24_4_ = fVar124 * 0.0;
        auVar34._28_4_ = 0;
        auVar135 = vcmpps_avx(auVar180,auVar34,6);
        auVar148 = auVar93 & auVar135;
        auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(fVar194,
                                                  CONCAT412(fVar194,CONCAT48(fVar194,CONCAT44(
                                                  fVar194,fVar194))))))));
        auVar102 = local_660;
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0x7f,0) != '\0') ||
              (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar148 >> 0xbf,0) != '\0') ||
            (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar148[0x1f] < '\0') {
          auVar122._8_4_ = 0xbf800000;
          auVar122._0_8_ = 0xbf800000bf800000;
          auVar122._12_4_ = 0xbf800000;
          auVar122._16_4_ = 0xbf800000;
          auVar122._20_4_ = 0xbf800000;
          auVar122._24_4_ = 0xbf800000;
          auVar122._28_4_ = 0xbf800000;
          auVar137._8_4_ = 0x40000000;
          auVar137._0_8_ = 0x4000000040000000;
          auVar137._12_4_ = 0x40000000;
          auVar137._16_4_ = 0x40000000;
          auVar137._20_4_ = 0x40000000;
          auVar137._24_4_ = 0x40000000;
          auVar137._28_4_ = 0x40000000;
          auVar9 = vfmadd213ps_fma(local_4e0,auVar137,auVar122);
          local_360 = ZEXT1632(auVar9);
          local_320 = 0;
          local_310 = local_6f0._0_8_;
          uStack_308 = local_6f0._8_8_;
          local_300 = local_790;
          uStack_2f8 = uStack_788;
          auVar145 = ZEXT1664(auVar14);
          local_4e0 = local_360;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar77 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar93 = vandps_avx(auVar135,auVar93);
              fVar124 = 1.0 / auVar96._0_4_;
              auVar145 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar124,CONCAT420(fVar124,CONCAT416(
                                                  fVar124,CONCAT412(fVar124,CONCAT48(fVar124,
                                                  CONCAT44(fVar124,fVar124))))))));
              local_2a0[0] = fVar124 * (auVar193._0_4_ + 0.0);
              local_2a0[1] = fVar124 * (auVar193._4_4_ + 1.0);
              local_2a0[2] = fVar124 * (auVar193._8_4_ + 2.0);
              local_2a0[3] = fVar124 * (auVar193._12_4_ + 3.0);
              fStack_290 = fVar124 * (auVar193._16_4_ + 4.0);
              fStack_28c = fVar124 * (auVar193._20_4_ + 5.0);
              fStack_288 = fVar124 * (auVar193._24_4_ + 6.0);
              fStack_284 = auVar193._28_4_ + 7.0;
              local_4e0._0_8_ = auVar9._0_8_;
              local_4e0._8_8_ = auVar9._8_8_;
              local_280 = local_4e0._0_8_;
              uStack_278 = local_4e0._8_8_;
              uStack_270 = 0;
              uStack_268 = 0;
              local_260 = auVar180;
              uVar83 = vmovmskps_avx(auVar93);
              if (uVar83 == 0) goto LAB_015f501a;
              uVar80 = 0;
              uVar85 = (ulong)(uVar83 & 0xff);
              for (uVar82 = uVar85; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                uVar80 = uVar80 + 1;
              }
              local_8c0._0_4_ = local_8c0._4_4_;
              local_8c0._8_4_ = local_8c0._4_4_;
              local_8c0._12_4_ = local_8c0._4_4_;
              local_8c0._16_4_ = local_8c0._4_4_;
              local_8c0._20_4_ = local_8c0._4_4_;
              local_8c0._24_4_ = local_8c0._4_4_;
              local_8c0._28_4_ = local_8c0._4_4_;
              local_6c0._0_4_ = local_6c0._4_4_;
              local_6c0._8_4_ = local_6c0._4_4_;
              local_6c0._12_4_ = local_6c0._4_4_;
              local_6c0._16_4_ = local_6c0._4_4_;
              local_6c0._20_4_ = local_6c0._4_4_;
              local_6c0._24_4_ = local_6c0._4_4_;
              local_6c0._28_4_ = local_6c0._4_4_;
              local_6e0 = ZEXT1632(CONCAT124(auVar13._4_12_,*(undefined4 *)(ray + k * 4 + 0x100)));
              local_680 = auVar180;
              _local_480 = *pauVar1;
              local_380 = local_660;
              local_340 = auVar180;
              local_31c = iVar79;
              local_2f0 = auVar14;
              do {
                local_1e0 = local_2a0[uVar80];
                local_1c0 = *(undefined4 *)((long)&local_280 + uVar80 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar80 * 4);
                fVar106 = 1.0 - local_1e0;
                auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106)),
                                          ZEXT416((uint)(local_1e0 * fVar106)),ZEXT416(0xc0000000));
                auVar9 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar106)),
                                         ZEXT416((uint)(local_1e0 * local_1e0)),ZEXT416(0x40000000))
                ;
                fVar124 = auVar9._0_4_ * 3.0;
                fVar104 = local_1e0 * local_1e0 * 3.0;
                auVar159._0_4_ = fVar104 * (float)local_590._0_4_;
                auVar159._4_4_ = fVar104 * (float)local_590._4_4_;
                auVar159._8_4_ = fVar104 * fStack_588;
                auVar159._12_4_ = fVar104 * fStack_584;
                auVar129._4_4_ = fVar124;
                auVar129._0_4_ = fVar124;
                auVar129._8_4_ = fVar124;
                auVar129._12_4_ = fVar124;
                auVar9 = vfmadd132ps_fma(auVar129,auVar159,auVar14);
                fVar124 = auVar11._0_4_ * 3.0;
                auVar153._4_4_ = fVar124;
                auVar153._0_4_ = fVar124;
                auVar153._8_4_ = fVar124;
                auVar153._12_4_ = fVar124;
                auVar9 = vfmadd132ps_fma(auVar153,auVar9,auVar114);
                fVar124 = fVar106 * fVar106 * -3.0;
                local_770.context = context->user;
                auVar130._4_4_ = fVar124;
                auVar130._0_4_ = fVar124;
                auVar130._8_4_ = fVar124;
                auVar130._12_4_ = fVar124;
                auVar11 = vfmadd132ps_fma(auVar130,auVar9,local_6f0);
                local_240 = auVar11._0_4_;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                auVar9 = vmovshdup_avx(auVar11);
                local_220 = auVar9._0_8_;
                uStack_218 = local_220;
                uStack_210 = local_220;
                uStack_208 = local_220;
                auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
                auVar131._0_8_ = auVar9._0_8_;
                auVar131._8_8_ = auVar131._0_8_;
                auVar138._16_8_ = auVar131._0_8_;
                auVar138._0_16_ = auVar131;
                auVar138._24_8_ = auVar131._0_8_;
                local_200 = auVar138;
                fStack_1dc = local_1e0;
                fStack_1d8 = local_1e0;
                fStack_1d4 = local_1e0;
                fStack_1d0 = local_1e0;
                fStack_1cc = local_1e0;
                fStack_1c8 = local_1e0;
                fStack_1c4 = local_1e0;
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_1a0 = local_6c0._0_8_;
                uStack_198 = local_6c0._8_8_;
                uStack_190 = local_6c0._16_8_;
                uStack_188 = local_6c0._24_8_;
                local_180 = local_8c0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                local_160 = (local_770.context)->instID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_140 = (local_770.context)->instPrimID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_640 = local_3e0;
                local_770.valid = (int *)local_640;
                local_770.geometryUserPtr = pGVar7->userPtr;
                local_770.hit = (RTCHitN *)&local_240;
                local_770.N = 8;
                local_770.ray = (RTCRayN *)ray;
                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar138 = ZEXT1632(auVar131);
                  (*pGVar7->occlusionFilterN)(&local_770);
                  auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,
                                                  CONCAT416(fVar194,CONCAT412(fVar194,CONCAT48(
                                                  fVar194,CONCAT44(fVar194,fVar194))))))));
                  auVar199 = ZEXT3264(local_680);
                  auVar193 = ZEXT3264(local_660);
                  auVar185 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar135 = vpcmpeqd_avx2(auVar185._0_32_,local_640);
                auVar139 = vpcmpeqd_avx2(auVar138,auVar138);
                auVar93 = auVar139 & ~auVar135;
                if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar93 >> 0x7f,0) == '\0') &&
                      (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar93 >> 0xbf,0) == '\0') &&
                    (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar93[0x1f]) {
                  auVar135 = auVar135 ^ auVar139;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&local_770);
                    auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,
                                                  CONCAT416(fVar194,CONCAT412(fVar194,CONCAT48(
                                                  fVar194,CONCAT44(fVar194,fVar194))))))));
                    auVar199 = ZEXT3264(local_680);
                    auVar193 = ZEXT3264(local_660);
                    auVar185 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar93 = vpcmpeqd_avx2(auVar185._0_32_,local_640);
                  auVar135 = vpcmpeqd_avx2(local_640,local_640);
                  auVar135 = auVar93 ^ auVar135;
                  auVar139._8_4_ = 0xff800000;
                  auVar139._0_8_ = 0xff800000ff800000;
                  auVar139._12_4_ = 0xff800000;
                  auVar139._16_4_ = 0xff800000;
                  auVar139._20_4_ = 0xff800000;
                  auVar139._24_4_ = 0xff800000;
                  auVar139._28_4_ = 0xff800000;
                  auVar93 = vblendvps_avx(auVar139,*(undefined1 (*) [32])(local_770.ray + 0x100),
                                          auVar93);
                  *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar93;
                }
                auVar145 = ZEXT3264(auVar139);
                auVar180 = auVar199._0_32_;
                auVar102 = auVar193._0_32_;
                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar135 >> 0x7f,0) != '\0') ||
                      (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0xbf,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar135[0x1f] < '\0') {
                  bVar77 = true;
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = local_6e0._0_4_;
                uVar82 = uVar80 & 0x3f;
                bVar77 = false;
                uVar80 = 0;
                uVar85 = uVar85 ^ 1L << uVar82;
                for (uVar82 = uVar85; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000)
                {
                  uVar80 = uVar80 + 1;
                }
              } while (uVar85 != 0);
            }
            goto LAB_015f4f48;
          }
          goto LAB_015f4f3f;
        }
LAB_015f501a:
        bVar77 = false;
      }
LAB_015f4f48:
      local_660 = auVar102;
      auVar199 = ZEXT3264(local_8e0);
      auVar185 = ZEXT3264(local_720);
      local_680 = auVar180;
      if (8 < iVar79) {
        local_5e0._4_4_ = iVar79;
        local_5e0._0_4_ = iVar79;
        local_5e0._8_4_ = iVar79;
        local_5e0._12_4_ = iVar79;
        local_5e0._16_4_ = iVar79;
        local_5e0._20_4_ = iVar79;
        local_5e0._24_4_ = iVar79;
        local_5e0._28_4_ = iVar79;
        local_4c0._4_4_ = fVar125;
        local_4c0._0_4_ = fVar125;
        fStack_4b8 = fVar125;
        fStack_4b4 = fVar125;
        fStack_4b0 = fVar125;
        fStack_4ac = fVar125;
        fStack_4a8 = fVar125;
        fStack_4a4 = fVar125;
        local_100 = local_740._0_4_;
        uStack_fc = local_740._0_4_;
        uStack_f8 = local_740._0_4_;
        uStack_f4 = local_740._0_4_;
        uStack_f0 = local_740._0_4_;
        uStack_ec = local_740._0_4_;
        uStack_e8 = local_740._0_4_;
        uStack_e4 = local_740._0_4_;
        local_120 = 1.0 / local_560;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_580 = CONCAT44((undefined4)local_580,(undefined4)local_580);
        uStack_578 = (undefined4)local_580;
        uStack_574 = (undefined4)local_580;
        uStack_570 = (undefined4)local_580;
        uStack_56c = (undefined4)local_580;
        uStack_568 = (undefined4)local_580;
        uStack_564 = (undefined4)local_580;
        lVar81 = 8;
        local_560 = (float)local_8c0._4_4_;
        uStack_55c = local_8c0._4_4_;
        uStack_558 = local_8c0._4_4_;
        uStack_554 = local_8c0._4_4_;
        uStack_550 = local_8c0._4_4_;
        uStack_54c = local_8c0._4_4_;
        uStack_548 = local_8c0._4_4_;
        uStack_544 = local_8c0._4_4_;
        do {
          auVar196 = auVar199._0_32_;
          auVar180 = auVar185._0_32_;
          auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar15);
          auVar135 = *(undefined1 (*) [32])(lVar15 + 0x21aa768 + lVar81 * 4);
          auVar148 = *(undefined1 (*) [32])(lVar15 + 0x21aabec + lVar81 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar15 + 0x21ab070 + lVar81 * 4);
          fVar110 = *(float *)*pauVar1;
          fVar66 = *(float *)(*pauVar1 + 4);
          fVar67 = *(float *)(*pauVar1 + 8);
          fVar68 = *(float *)(*pauVar1 + 0xc);
          fVar69 = *(float *)(*pauVar1 + 0x10);
          fVar70 = *(float *)(*pauVar1 + 0x14);
          fVar71 = *(float *)(*pauVar1 + 0x18);
          auVar74 = *(undefined1 (*) [28])*pauVar1;
          auVar193._0_4_ = fVar110 * auVar171._0_4_;
          auVar193._4_4_ = fVar66 * auVar171._4_4_;
          auVar193._8_4_ = fVar67 * auVar171._8_4_;
          auVar193._12_4_ = fVar68 * auVar171._12_4_;
          auVar193._16_4_ = fVar69 * auVar171._16_4_;
          auVar193._20_4_ = fVar70 * auVar171._20_4_;
          auVar193._28_36_ = auVar199._28_36_;
          auVar193._24_4_ = fVar71 * auVar171._24_4_;
          auVar185._0_4_ = fVar110 * fVar103;
          auVar185._4_4_ = fVar66 * fVar105;
          auVar185._8_4_ = fVar67 * fVar103;
          auVar185._12_4_ = fVar68 * fVar105;
          auVar185._16_4_ = fVar69 * fVar103;
          auVar185._20_4_ = fVar70 * fVar105;
          auVar185._28_36_ = auVar145._28_36_;
          auVar185._24_4_ = fVar71 * fVar103;
          auVar9 = vfmadd231ps_fma(auVar193._0_32_,auVar148,auVar116);
          auVar11 = vfmadd231ps_fma(auVar185._0_32_,auVar148,auVar189);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,auVar166);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar135,auVar205);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar93,auVar161);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar93,local_5c0);
          auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar15);
          auVar121 = *(undefined1 (*) [32])(lVar15 + 0x21acb88 + lVar81 * 4);
          auVar184 = *(undefined1 (*) [32])(lVar15 + 0x21ad00c + lVar81 * 4);
          pfVar2 = (float *)(lVar15 + 0x21ad490 + lVar81 * 4);
          fVar72 = *pfVar2;
          fVar201 = pfVar2[1];
          fVar207 = pfVar2[2];
          fVar208 = pfVar2[3];
          fVar209 = pfVar2[4];
          fVar210 = pfVar2[5];
          fVar211 = pfVar2[6];
          auVar35._4_4_ = fVar201 * auVar171._4_4_;
          auVar35._0_4_ = fVar72 * auVar171._0_4_;
          auVar35._8_4_ = fVar207 * auVar171._8_4_;
          auVar35._12_4_ = fVar208 * auVar171._12_4_;
          auVar35._16_4_ = fVar209 * auVar171._16_4_;
          auVar35._20_4_ = fVar210 * auVar171._20_4_;
          auVar35._24_4_ = fVar211 * auVar171._24_4_;
          auVar35._28_4_ = auVar135._28_4_;
          auVar145._0_4_ = fVar72 * fVar103;
          auVar145._4_4_ = fVar201 * fVar105;
          auVar145._8_4_ = fVar207 * fVar103;
          auVar145._12_4_ = fVar208 * fVar105;
          auVar145._16_4_ = fVar209 * fVar103;
          auVar145._20_4_ = fVar210 * fVar105;
          auVar145._28_36_ = auVar171._28_36_;
          auVar145._24_4_ = fVar211 * fVar103;
          auVar12 = vfmadd231ps_fma(auVar35,auVar184,auVar116);
          auVar13 = vfmadd231ps_fma(auVar145._0_32_,auVar184,auVar189);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar121,auVar166);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,auVar205);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar102,auVar161);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,local_5c0);
          local_6e0 = ZEXT1632(auVar12);
          local_420 = ZEXT1632(auVar9);
          local_740 = vsubps_avx(local_6e0,local_420);
          local_6c0 = ZEXT1632(auVar13);
          auVar140 = ZEXT1632(auVar11);
          local_460 = vsubps_avx(local_6c0,auVar140);
          auVar36._4_4_ = auVar11._4_4_ * local_740._4_4_;
          auVar36._0_4_ = auVar11._0_4_ * local_740._0_4_;
          auVar36._8_4_ = auVar11._8_4_ * local_740._8_4_;
          auVar36._12_4_ = auVar11._12_4_ * local_740._12_4_;
          auVar36._16_4_ = local_740._16_4_ * 0.0;
          auVar36._20_4_ = local_740._20_4_ * 0.0;
          auVar36._24_4_ = local_740._24_4_ * 0.0;
          auVar36._28_4_ = auVar102._28_4_;
          fVar125 = local_460._0_4_;
          fVar124 = local_460._4_4_;
          auVar76._4_4_ = auVar9._4_4_ * fVar124;
          auVar76._0_4_ = auVar9._0_4_ * fVar125;
          fVar104 = local_460._8_4_;
          auVar76._8_4_ = auVar9._8_4_ * fVar104;
          fVar106 = local_460._12_4_;
          auVar76._12_4_ = auVar9._12_4_ * fVar106;
          fVar107 = local_460._16_4_;
          auVar76._16_4_ = fVar107 * 0.0;
          fVar108 = local_460._20_4_;
          auVar76._20_4_ = fVar108 * 0.0;
          fVar109 = local_460._24_4_;
          auVar76._24_4_ = fVar109 * 0.0;
          auVar76._28_4_ = auVar10._4_4_;
          auVar101 = vsubps_avx(auVar36,auVar76);
          auVar141._0_4_ = fVar110 * (float)local_3c0._0_4_;
          auVar141._4_4_ = fVar66 * (float)local_3c0._4_4_;
          auVar141._8_4_ = fVar67 * fStack_3b8;
          auVar141._12_4_ = fVar68 * fStack_3b4;
          auVar141._16_4_ = fVar69 * fStack_3b0;
          auVar141._20_4_ = fVar70 * fStack_3ac;
          auVar141._24_4_ = fVar71 * fStack_3a8;
          auVar141._28_4_ = 0;
          auVar9 = vfmadd231ps_fma(auVar141,local_a0,auVar148);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_80,auVar135);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_3a0,auVar93);
          auVar145 = ZEXT1664(auVar9);
          auVar37._4_4_ = fVar201 * (float)local_3c0._4_4_;
          auVar37._0_4_ = fVar72 * (float)local_3c0._0_4_;
          auVar37._8_4_ = fVar207 * fStack_3b8;
          auVar37._12_4_ = fVar208 * fStack_3b4;
          auVar37._16_4_ = fVar209 * fStack_3b0;
          auVar37._20_4_ = fVar210 * fStack_3ac;
          auVar37._24_4_ = fVar211 * fStack_3a8;
          auVar37._28_4_ = uStack_3a4;
          auVar11 = vfmadd231ps_fma(auVar37,auVar184,local_a0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,local_80);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar102,local_3a0);
          auVar38._4_4_ = fVar124 * fVar124;
          auVar38._0_4_ = fVar125 * fVar125;
          auVar38._8_4_ = fVar104 * fVar104;
          auVar38._12_4_ = fVar106 * fVar106;
          auVar38._16_4_ = fVar107 * fVar107;
          auVar38._20_4_ = fVar108 * fVar108;
          auVar38._24_4_ = fVar109 * fVar109;
          auVar38._28_4_ = local_3a0._28_4_;
          auVar12 = vfmadd231ps_fma(auVar38,local_740,local_740);
          local_540 = ZEXT1632(auVar11);
          auVar179 = vmaxps_avx(ZEXT1632(auVar9),local_540);
          auVar181._0_4_ = auVar179._0_4_ * auVar179._0_4_ * auVar12._0_4_;
          auVar181._4_4_ = auVar179._4_4_ * auVar179._4_4_ * auVar12._4_4_;
          auVar181._8_4_ = auVar179._8_4_ * auVar179._8_4_ * auVar12._8_4_;
          auVar181._12_4_ = auVar179._12_4_ * auVar179._12_4_ * auVar12._12_4_;
          auVar181._16_4_ = auVar179._16_4_ * auVar179._16_4_ * 0.0;
          auVar181._20_4_ = auVar179._20_4_ * auVar179._20_4_ * 0.0;
          auVar181._24_4_ = auVar179._24_4_ * auVar179._24_4_ * 0.0;
          auVar181._28_4_ = 0;
          auVar39._4_4_ = auVar101._4_4_ * auVar101._4_4_;
          auVar39._0_4_ = auVar101._0_4_ * auVar101._0_4_;
          auVar39._8_4_ = auVar101._8_4_ * auVar101._8_4_;
          auVar39._12_4_ = auVar101._12_4_ * auVar101._12_4_;
          auVar39._16_4_ = auVar101._16_4_ * auVar101._16_4_;
          auVar39._20_4_ = auVar101._20_4_ * auVar101._20_4_;
          auVar39._24_4_ = auVar101._24_4_ * auVar101._24_4_;
          auVar39._28_4_ = auVar101._28_4_;
          auVar179 = vcmpps_avx(auVar39,auVar181,2);
          local_320 = (int)lVar81;
          auVar182._4_4_ = local_320;
          auVar182._0_4_ = local_320;
          auVar182._8_4_ = local_320;
          auVar182._12_4_ = local_320;
          auVar182._16_4_ = local_320;
          auVar182._20_4_ = local_320;
          auVar182._24_4_ = local_320;
          auVar182._28_4_ = local_320;
          auVar101 = vpor_avx2(auVar182,_DAT_01fe9900);
          auVar95 = vpcmpgtd_avx2(local_5e0,auVar101);
          auVar101 = auVar95 & auVar179;
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0x7f,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0xbf,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar101[0x1f]) {
            auVar185 = ZEXT3264(auVar180);
            auVar199 = ZEXT3264(auVar196);
LAB_015f5da5:
            auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
          }
          else {
            _local_480 = vandps_avx(auVar95,auVar179);
            auVar40._4_4_ = fVar201 * local_e0._4_4_;
            auVar40._0_4_ = fVar72 * (float)local_e0;
            auVar40._8_4_ = fVar207 * (float)uStack_d8;
            auVar40._12_4_ = fVar208 * uStack_d8._4_4_;
            auVar40._16_4_ = fVar209 * (float)uStack_d0;
            auVar40._20_4_ = fVar210 * uStack_d0._4_4_;
            auVar40._24_4_ = fVar211 * (float)uStack_c8;
            auVar40._28_4_ = auVar179._28_4_;
            auVar11 = vfmadd213ps_fma(auVar184,local_c0,auVar40);
            auVar11 = vfmadd213ps_fma(auVar121,local_520,ZEXT1632(auVar11));
            auVar11 = vfmadd132ps_fma(auVar102,ZEXT1632(auVar11),local_6a0);
            local_4a0 = ZEXT1632(auVar11);
            local_440._0_4_ = auVar74._0_4_;
            local_440._4_4_ = auVar74._4_4_;
            fStack_438 = auVar74._8_4_;
            fStack_434 = auVar74._12_4_;
            fStack_430 = auVar74._16_4_;
            fStack_42c = auVar74._20_4_;
            fStack_428 = auVar74._24_4_;
            auVar41._4_4_ = local_e0._4_4_ * (float)local_440._4_4_;
            auVar41._0_4_ = (float)local_e0 * (float)local_440._0_4_;
            auVar41._8_4_ = (float)uStack_d8 * fStack_438;
            auVar41._12_4_ = uStack_d8._4_4_ * fStack_434;
            auVar41._16_4_ = (float)uStack_d0 * fStack_430;
            auVar41._20_4_ = uStack_d0._4_4_ * fStack_42c;
            auVar41._24_4_ = (float)uStack_c8 * fStack_428;
            auVar41._28_4_ = auVar179._28_4_;
            auVar11 = vfmadd213ps_fma(auVar148,local_c0,auVar41);
            auVar11 = vfmadd213ps_fma(auVar135,local_520,ZEXT1632(auVar11));
            auVar135 = *(undefined1 (*) [32])(lVar15 + 0x21ab4f4 + lVar81 * 4);
            auVar148 = *(undefined1 (*) [32])(lVar15 + 0x21ab978 + lVar81 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar15 + 0x21abdfc + lVar81 * 4);
            pfVar3 = (float *)(lVar15 + 0x21ac280 + lVar81 * 4);
            fVar125 = *pfVar3;
            fVar124 = pfVar3[1];
            fVar104 = pfVar3[2];
            fVar106 = pfVar3[3];
            fVar107 = pfVar3[4];
            fVar108 = pfVar3[5];
            fVar109 = pfVar3[6];
            auVar42._4_4_ = fVar194 * fVar124;
            auVar42._0_4_ = fVar194 * fVar125;
            auVar42._8_4_ = fVar194 * fVar104;
            auVar42._12_4_ = fVar194 * fVar106;
            auVar42._16_4_ = fVar194 * fVar107;
            auVar42._20_4_ = fVar194 * fVar108;
            auVar42._24_4_ = fVar194 * fVar109;
            auVar42._28_4_ = pfVar2[7];
            auVar197._0_4_ = fVar103 * fVar125;
            auVar197._4_4_ = fVar105 * fVar124;
            auVar197._8_4_ = fVar103 * fVar104;
            auVar197._12_4_ = fVar105 * fVar106;
            auVar197._16_4_ = fVar103 * fVar107;
            auVar197._20_4_ = fVar105 * fVar108;
            auVar197._24_4_ = fVar103 * fVar109;
            auVar197._28_4_ = 0;
            auVar43._4_4_ = fVar124 * local_e0._4_4_;
            auVar43._0_4_ = fVar125 * (float)local_e0;
            auVar43._8_4_ = fVar104 * (float)uStack_d8;
            auVar43._12_4_ = fVar106 * uStack_d8._4_4_;
            auVar43._16_4_ = fVar107 * (float)uStack_d0;
            auVar43._20_4_ = fVar108 * uStack_d0._4_4_;
            auVar43._24_4_ = fVar109 * (float)uStack_c8;
            auVar43._28_4_ = pfVar3[7];
            auVar12 = vfmadd231ps_fma(auVar42,auVar102,auVar116);
            auVar13 = vfmadd231ps_fma(auVar197,auVar102,auVar189);
            auVar90 = vfmadd231ps_fma(auVar43,local_c0,auVar102);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar148,auVar166);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar148,auVar205);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_520,auVar148);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar135,auVar161);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar135,local_5c0);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar135,local_6a0);
            pfVar2 = (float *)(lVar15 + 0x21ae6a0 + lVar81 * 4);
            fVar125 = *pfVar2;
            fVar124 = pfVar2[1];
            fVar104 = pfVar2[2];
            fVar106 = pfVar2[3];
            fVar107 = pfVar2[4];
            fVar108 = pfVar2[5];
            fVar109 = pfVar2[6];
            auVar44._4_4_ = fVar194 * fVar124;
            auVar44._0_4_ = fVar194 * fVar125;
            auVar44._8_4_ = fVar194 * fVar104;
            auVar44._12_4_ = fVar194 * fVar106;
            auVar44._16_4_ = fVar194 * fVar107;
            auVar44._20_4_ = fVar194 * fVar108;
            auVar44._24_4_ = fVar194 * fVar109;
            auVar44._28_4_ = fVar194;
            auVar45._4_4_ = fVar105 * fVar124;
            auVar45._0_4_ = fVar103 * fVar125;
            auVar45._8_4_ = fVar103 * fVar104;
            auVar45._12_4_ = fVar105 * fVar106;
            auVar45._16_4_ = fVar103 * fVar107;
            auVar45._20_4_ = fVar105 * fVar108;
            auVar45._24_4_ = fVar103 * fVar109;
            auVar45._28_4_ = fVar105;
            auVar46._4_4_ = local_e0._4_4_ * fVar124;
            auVar46._0_4_ = (float)local_e0 * fVar125;
            auVar46._8_4_ = (float)uStack_d8 * fVar104;
            auVar46._12_4_ = uStack_d8._4_4_ * fVar106;
            auVar46._16_4_ = (float)uStack_d0 * fVar107;
            auVar46._20_4_ = uStack_d0._4_4_ * fVar108;
            auVar46._24_4_ = (float)uStack_c8 * fVar109;
            auVar46._28_4_ = pfVar2[7];
            auVar135 = *(undefined1 (*) [32])(lVar15 + 0x21ae21c + lVar81 * 4);
            auVar89 = vfmadd231ps_fma(auVar44,auVar135,auVar116);
            auVar126 = vfmadd231ps_fma(auVar45,auVar135,auVar189);
            auVar113 = vfmadd231ps_fma(auVar46,local_c0,auVar135);
            auVar135 = *(undefined1 (*) [32])(lVar15 + 0x21add98 + lVar81 * 4);
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar135,auVar166);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar135,auVar205);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_520,auVar135);
            auVar135 = *(undefined1 (*) [32])(lVar15 + 0x21ad914 + lVar81 * 4);
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar135,auVar161);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar135,local_5c0);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_6a0,auVar135);
            auVar183._8_4_ = 0x7fffffff;
            auVar183._0_8_ = 0x7fffffff7fffffff;
            auVar183._12_4_ = 0x7fffffff;
            auVar183._16_4_ = 0x7fffffff;
            auVar183._20_4_ = 0x7fffffff;
            auVar183._24_4_ = 0x7fffffff;
            auVar183._28_4_ = 0x7fffffff;
            auVar135 = vandps_avx(ZEXT1632(auVar12),auVar183);
            auVar148 = vandps_avx(ZEXT1632(auVar13),auVar183);
            auVar148 = vmaxps_avx(auVar135,auVar148);
            auVar135 = vandps_avx(ZEXT1632(auVar90),auVar183);
            auVar135 = vmaxps_avx(auVar148,auVar135);
            auVar135 = vcmpps_avx(auVar135,_local_4c0,1);
            auVar102 = vblendvps_avx(ZEXT1632(auVar12),local_740,auVar135);
            auVar121 = vblendvps_avx(ZEXT1632(auVar13),local_460,auVar135);
            auVar135 = vandps_avx(ZEXT1632(auVar89),auVar183);
            auVar148 = vandps_avx(ZEXT1632(auVar126),auVar183);
            auVar148 = vmaxps_avx(auVar135,auVar148);
            auVar135 = vandps_avx(auVar183,ZEXT1632(auVar113));
            auVar135 = vmaxps_avx(auVar148,auVar135);
            auVar148 = vcmpps_avx(auVar135,_local_4c0,1);
            auVar135 = vblendvps_avx(ZEXT1632(auVar89),local_740,auVar148);
            auVar148 = vblendvps_avx(ZEXT1632(auVar126),local_460,auVar148);
            auVar11 = vfmadd213ps_fma(auVar93,local_6a0,ZEXT1632(auVar11));
            auVar12 = vfmadd213ps_fma(auVar102,auVar102,ZEXT832(0) << 0x20);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar121,auVar121);
            auVar93 = vrsqrtps_avx(ZEXT1632(auVar12));
            fVar125 = auVar93._0_4_;
            fVar124 = auVar93._4_4_;
            fVar104 = auVar93._8_4_;
            fVar106 = auVar93._12_4_;
            fVar107 = auVar93._16_4_;
            fVar108 = auVar93._20_4_;
            fVar109 = auVar93._24_4_;
            auVar47._4_4_ = fVar124 * fVar124 * fVar124 * auVar12._4_4_ * -0.5;
            auVar47._0_4_ = fVar125 * fVar125 * fVar125 * auVar12._0_4_ * -0.5;
            auVar47._8_4_ = fVar104 * fVar104 * fVar104 * auVar12._8_4_ * -0.5;
            auVar47._12_4_ = fVar106 * fVar106 * fVar106 * auVar12._12_4_ * -0.5;
            auVar47._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
            auVar47._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
            auVar47._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar47._28_4_ = 0;
            auVar206._8_4_ = 0x3fc00000;
            auVar206._0_8_ = 0x3fc000003fc00000;
            auVar206._12_4_ = 0x3fc00000;
            auVar206._16_4_ = 0x3fc00000;
            auVar206._20_4_ = 0x3fc00000;
            auVar206._24_4_ = 0x3fc00000;
            auVar206._28_4_ = 0x3fc00000;
            auVar12 = vfmadd231ps_fma(auVar47,auVar206,auVar93);
            fVar125 = auVar12._0_4_;
            fVar124 = auVar12._4_4_;
            auVar48._4_4_ = auVar121._4_4_ * fVar124;
            auVar48._0_4_ = auVar121._0_4_ * fVar125;
            fVar104 = auVar12._8_4_;
            auVar48._8_4_ = auVar121._8_4_ * fVar104;
            fVar106 = auVar12._12_4_;
            auVar48._12_4_ = auVar121._12_4_ * fVar106;
            auVar48._16_4_ = auVar121._16_4_ * 0.0;
            auVar48._20_4_ = auVar121._20_4_ * 0.0;
            auVar48._24_4_ = auVar121._24_4_ * 0.0;
            auVar48._28_4_ = auVar93._28_4_;
            auVar49._4_4_ = fVar124 * -auVar102._4_4_;
            auVar49._0_4_ = fVar125 * -auVar102._0_4_;
            auVar49._8_4_ = fVar104 * -auVar102._8_4_;
            auVar49._12_4_ = fVar106 * -auVar102._12_4_;
            auVar49._16_4_ = -auVar102._16_4_ * 0.0;
            auVar49._20_4_ = -auVar102._20_4_ * 0.0;
            auVar49._24_4_ = -auVar102._24_4_ * 0.0;
            auVar49._28_4_ = auVar121._28_4_;
            auVar12 = vfmadd213ps_fma(auVar135,auVar135,ZEXT832(0) << 0x20);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar148,auVar148);
            auVar93 = vrsqrtps_avx(ZEXT1632(auVar12));
            auVar50._28_4_ = uVar172;
            auVar50._0_28_ =
                 ZEXT1628(CONCAT412(fVar106 * 0.0,
                                    CONCAT48(fVar104 * 0.0,CONCAT44(fVar124 * 0.0,fVar125 * 0.0))));
            fVar125 = auVar93._0_4_;
            fVar124 = auVar93._4_4_;
            fVar104 = auVar93._8_4_;
            fVar106 = auVar93._12_4_;
            fVar107 = auVar93._16_4_;
            fVar108 = auVar93._20_4_;
            fVar109 = auVar93._24_4_;
            auVar51._4_4_ = fVar124 * fVar124 * fVar124 * auVar12._4_4_ * -0.5;
            auVar51._0_4_ = fVar125 * fVar125 * fVar125 * auVar12._0_4_ * -0.5;
            auVar51._8_4_ = fVar104 * fVar104 * fVar104 * auVar12._8_4_ * -0.5;
            auVar51._12_4_ = fVar106 * fVar106 * fVar106 * auVar12._12_4_ * -0.5;
            auVar51._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
            auVar51._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
            auVar51._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar51._28_4_ = 0;
            auVar12 = vfmadd231ps_fma(auVar51,auVar206,auVar93);
            fVar125 = auVar12._0_4_;
            fVar124 = auVar12._4_4_;
            auVar52._4_4_ = auVar148._4_4_ * fVar124;
            auVar52._0_4_ = auVar148._0_4_ * fVar125;
            fVar104 = auVar12._8_4_;
            auVar52._8_4_ = auVar148._8_4_ * fVar104;
            fVar106 = auVar12._12_4_;
            auVar52._12_4_ = auVar148._12_4_ * fVar106;
            auVar52._16_4_ = auVar148._16_4_ * 0.0;
            auVar52._20_4_ = auVar148._20_4_ * 0.0;
            auVar52._24_4_ = auVar148._24_4_ * 0.0;
            auVar52._28_4_ = 0;
            auVar53._4_4_ = fVar124 * -auVar135._4_4_;
            auVar53._0_4_ = fVar125 * -auVar135._0_4_;
            auVar53._8_4_ = fVar104 * -auVar135._8_4_;
            auVar53._12_4_ = fVar106 * -auVar135._12_4_;
            auVar53._16_4_ = -auVar135._16_4_ * 0.0;
            auVar53._20_4_ = -auVar135._20_4_ * 0.0;
            auVar53._24_4_ = -auVar135._24_4_ * 0.0;
            auVar53._28_4_ = auVar93._28_4_;
            auVar54._28_4_ = 0xbf000000;
            auVar54._0_28_ =
                 ZEXT1628(CONCAT412(fVar106 * 0.0,
                                    CONCAT48(fVar104 * 0.0,CONCAT44(fVar124 * 0.0,fVar125 * 0.0))));
            auVar12 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar9),local_420);
            auVar93 = ZEXT1632(auVar9);
            auVar13 = vfmadd213ps_fma(auVar49,auVar93,auVar140);
            auVar90 = vfmadd213ps_fma(auVar50,auVar93,ZEXT1632(auVar11));
            auVar146 = vfnmadd213ps_fma(auVar48,auVar93,local_420);
            auVar89 = vfmadd213ps_fma(auVar52,local_540,local_6e0);
            auVar152 = vfnmadd213ps_fma(auVar49,auVar93,auVar140);
            auVar126 = vfmadd213ps_fma(auVar53,local_540,local_6c0);
            auVar142 = ZEXT1632(auVar9);
            auVar11 = vfnmadd231ps_fma(ZEXT1632(auVar11),auVar142,auVar50);
            auVar113 = vfmadd213ps_fma(auVar54,local_540,local_4a0);
            auVar87 = vfnmadd213ps_fma(auVar52,local_540,local_6e0);
            auVar112 = vfnmadd213ps_fma(auVar53,local_540,local_6c0);
            auVar151 = vfnmadd231ps_fma(local_4a0,local_540,auVar54);
            auVar93 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar152));
            auVar135 = vsubps_avx(ZEXT1632(auVar113),ZEXT1632(auVar11));
            auVar55._4_4_ = auVar93._4_4_ * auVar11._4_4_;
            auVar55._0_4_ = auVar93._0_4_ * auVar11._0_4_;
            auVar55._8_4_ = auVar93._8_4_ * auVar11._8_4_;
            auVar55._12_4_ = auVar93._12_4_ * auVar11._12_4_;
            auVar55._16_4_ = auVar93._16_4_ * 0.0;
            auVar55._20_4_ = auVar93._20_4_ * 0.0;
            auVar55._24_4_ = auVar93._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar152),auVar135);
            auVar56._4_4_ = auVar146._4_4_ * auVar135._4_4_;
            auVar56._0_4_ = auVar146._0_4_ * auVar135._0_4_;
            auVar56._8_4_ = auVar146._8_4_ * auVar135._8_4_;
            auVar56._12_4_ = auVar146._12_4_ * auVar135._12_4_;
            auVar56._16_4_ = auVar135._16_4_ * 0.0;
            auVar56._20_4_ = auVar135._20_4_ * 0.0;
            auVar56._24_4_ = auVar135._24_4_ * 0.0;
            auVar56._28_4_ = auVar135._28_4_;
            auVar184 = ZEXT1632(auVar146);
            auVar135 = vsubps_avx(ZEXT1632(auVar89),auVar184);
            auVar101 = ZEXT1632(auVar11);
            auVar11 = vfmsub231ps_fma(auVar56,auVar101,auVar135);
            auVar57._4_4_ = auVar152._4_4_ * auVar135._4_4_;
            auVar57._0_4_ = auVar152._0_4_ * auVar135._0_4_;
            auVar57._8_4_ = auVar152._8_4_ * auVar135._8_4_;
            auVar57._12_4_ = auVar152._12_4_ * auVar135._12_4_;
            auVar57._16_4_ = auVar135._16_4_ * 0.0;
            auVar57._20_4_ = auVar135._20_4_ * 0.0;
            auVar57._24_4_ = auVar135._24_4_ * 0.0;
            auVar57._28_4_ = auVar135._28_4_;
            auVar146 = vfmsub231ps_fma(auVar57,auVar184,auVar93);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar146),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar88));
            auVar95 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,2);
            auVar93 = vblendvps_avx(ZEXT1632(auVar87),ZEXT1632(auVar12),auVar95);
            auVar135 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar13),auVar95);
            local_740 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar90),auVar95);
            auVar148 = vblendvps_avx(auVar184,ZEXT1632(auVar89),auVar95);
            auVar102 = vblendvps_avx(ZEXT1632(auVar152),ZEXT1632(auVar126),auVar95);
            auVar121 = vblendvps_avx(auVar101,ZEXT1632(auVar113),auVar95);
            auVar184 = vblendvps_avx(ZEXT1632(auVar89),auVar184,auVar95);
            auVar179 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar152),auVar95);
            auVar11 = vpackssdw_avx(local_480._0_16_,local_480._16_16_);
            auVar101 = vblendvps_avx(ZEXT1632(auVar113),auVar101,auVar95);
            auVar184 = vsubps_avx(auVar184,auVar93);
            auVar179 = vsubps_avx(auVar179,auVar135);
            auVar140 = vsubps_avx(auVar101,local_740);
            auVar94 = vsubps_avx(auVar93,auVar148);
            auVar96 = vsubps_avx(auVar135,auVar102);
            auVar117 = vsubps_avx(local_740,auVar121);
            auVar163._0_4_ = auVar140._0_4_ * auVar93._0_4_;
            auVar163._4_4_ = auVar140._4_4_ * auVar93._4_4_;
            auVar163._8_4_ = auVar140._8_4_ * auVar93._8_4_;
            auVar163._12_4_ = auVar140._12_4_ * auVar93._12_4_;
            auVar163._16_4_ = auVar140._16_4_ * auVar93._16_4_;
            auVar163._20_4_ = auVar140._20_4_ * auVar93._20_4_;
            auVar163._24_4_ = auVar140._24_4_ * auVar93._24_4_;
            auVar163._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar163,local_740,auVar184);
            auVar58._4_4_ = auVar184._4_4_ * auVar135._4_4_;
            auVar58._0_4_ = auVar184._0_4_ * auVar135._0_4_;
            auVar58._8_4_ = auVar184._8_4_ * auVar135._8_4_;
            auVar58._12_4_ = auVar184._12_4_ * auVar135._12_4_;
            auVar58._16_4_ = auVar184._16_4_ * auVar135._16_4_;
            auVar58._20_4_ = auVar184._20_4_ * auVar135._20_4_;
            auVar58._24_4_ = auVar184._24_4_ * auVar135._24_4_;
            auVar58._28_4_ = auVar101._28_4_;
            auVar13 = vfmsub231ps_fma(auVar58,auVar93,auVar179);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar164._0_4_ = auVar179._0_4_ * local_740._0_4_;
            auVar164._4_4_ = auVar179._4_4_ * local_740._4_4_;
            auVar164._8_4_ = auVar179._8_4_ * local_740._8_4_;
            auVar164._12_4_ = auVar179._12_4_ * local_740._12_4_;
            auVar164._16_4_ = auVar179._16_4_ * local_740._16_4_;
            auVar164._20_4_ = auVar179._20_4_ * local_740._20_4_;
            auVar164._24_4_ = auVar179._24_4_ * local_740._24_4_;
            auVar164._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar164,auVar135,auVar140);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar145 = ZEXT1664(auVar13);
            auVar165._0_4_ = auVar117._0_4_ * auVar148._0_4_;
            auVar165._4_4_ = auVar117._4_4_ * auVar148._4_4_;
            auVar165._8_4_ = auVar117._8_4_ * auVar148._8_4_;
            auVar165._12_4_ = auVar117._12_4_ * auVar148._12_4_;
            auVar165._16_4_ = auVar117._16_4_ * auVar148._16_4_;
            auVar165._20_4_ = auVar117._20_4_ * auVar148._20_4_;
            auVar165._24_4_ = auVar117._24_4_ * auVar148._24_4_;
            auVar165._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar165,auVar94,auVar121);
            auVar59._4_4_ = auVar96._4_4_ * auVar121._4_4_;
            auVar59._0_4_ = auVar96._0_4_ * auVar121._0_4_;
            auVar59._8_4_ = auVar96._8_4_ * auVar121._8_4_;
            auVar59._12_4_ = auVar96._12_4_ * auVar121._12_4_;
            auVar59._16_4_ = auVar96._16_4_ * auVar121._16_4_;
            auVar59._20_4_ = auVar96._20_4_ * auVar121._20_4_;
            auVar59._24_4_ = auVar96._24_4_ * auVar121._24_4_;
            auVar59._28_4_ = auVar93._28_4_;
            auVar90 = vfmsub231ps_fma(auVar59,auVar102,auVar117);
            auVar60._4_4_ = auVar94._4_4_ * auVar102._4_4_;
            auVar60._0_4_ = auVar94._0_4_ * auVar102._0_4_;
            auVar60._8_4_ = auVar94._8_4_ * auVar102._8_4_;
            auVar60._12_4_ = auVar94._12_4_ * auVar102._12_4_;
            auVar60._16_4_ = auVar94._16_4_ * auVar102._16_4_;
            auVar60._20_4_ = auVar94._20_4_ * auVar102._20_4_;
            auVar60._24_4_ = auVar94._24_4_ * auVar102._24_4_;
            auVar60._28_4_ = auVar102._28_4_;
            auVar89 = vfmsub231ps_fma(auVar60,auVar96,auVar148);
            auVar102 = ZEXT832(0) << 0x20;
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar102,ZEXT1632(auVar12));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar102,ZEXT1632(auVar90));
            auVar148 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar90));
            auVar148 = vcmpps_avx(auVar148,auVar102,2);
            auVar12 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
            auVar12 = vpand_avx(auVar12,auVar11);
            auVar148 = vpmovsxwd_avx2(auVar12);
            if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar148 >> 0x7f,0) == '\0') &&
                  (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar148 >> 0xbf,0) == '\0') &&
                (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar148[0x1f]) {
LAB_015f62d9:
              auVar150._8_8_ = uStack_5f8;
              auVar150._0_8_ = local_600;
              auVar150._16_8_ = uStack_5f0;
              auVar150._24_8_ = uStack_5e8;
              auVar185 = ZEXT3264(auVar180);
              auVar199 = ZEXT3264(auVar196);
            }
            else {
              auVar61._4_4_ = auVar179._4_4_ * auVar117._4_4_;
              auVar61._0_4_ = auVar179._0_4_ * auVar117._0_4_;
              auVar61._8_4_ = auVar179._8_4_ * auVar117._8_4_;
              auVar61._12_4_ = auVar179._12_4_ * auVar117._12_4_;
              auVar61._16_4_ = auVar179._16_4_ * auVar117._16_4_;
              auVar61._20_4_ = auVar179._20_4_ * auVar117._20_4_;
              auVar61._24_4_ = auVar179._24_4_ * auVar117._24_4_;
              auVar61._28_4_ = auVar148._28_4_;
              auVar88 = vfmsub231ps_fma(auVar61,auVar96,auVar140);
              auVar167._0_4_ = auVar140._0_4_ * auVar94._0_4_;
              auVar167._4_4_ = auVar140._4_4_ * auVar94._4_4_;
              auVar167._8_4_ = auVar140._8_4_ * auVar94._8_4_;
              auVar167._12_4_ = auVar140._12_4_ * auVar94._12_4_;
              auVar167._16_4_ = auVar140._16_4_ * auVar94._16_4_;
              auVar167._20_4_ = auVar140._20_4_ * auVar94._20_4_;
              auVar167._24_4_ = auVar140._24_4_ * auVar94._24_4_;
              auVar167._28_4_ = 0;
              auVar113 = vfmsub231ps_fma(auVar167,auVar184,auVar117);
              auVar62._4_4_ = auVar184._4_4_ * auVar96._4_4_;
              auVar62._0_4_ = auVar184._0_4_ * auVar96._0_4_;
              auVar62._8_4_ = auVar184._8_4_ * auVar96._8_4_;
              auVar62._12_4_ = auVar184._12_4_ * auVar96._12_4_;
              auVar62._16_4_ = auVar184._16_4_ * auVar96._16_4_;
              auVar62._20_4_ = auVar184._20_4_ * auVar96._20_4_;
              auVar62._24_4_ = auVar184._24_4_ * auVar96._24_4_;
              auVar62._28_4_ = auVar96._28_4_;
              auVar146 = vfmsub231ps_fma(auVar62,auVar94,auVar179);
              auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar113),ZEXT1632(auVar146));
              auVar126 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar88),auVar102);
              auVar148 = vrcpps_avx(ZEXT1632(auVar126));
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = 0x3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar89 = vfnmadd213ps_fma(auVar148,ZEXT1632(auVar126),auVar198);
              auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar148,auVar148);
              auVar63._4_4_ = auVar146._4_4_ * local_740._4_4_;
              auVar63._0_4_ = auVar146._0_4_ * local_740._0_4_;
              auVar63._8_4_ = auVar146._8_4_ * local_740._8_4_;
              auVar63._12_4_ = auVar146._12_4_ * local_740._12_4_;
              auVar63._16_4_ = local_740._16_4_ * 0.0;
              auVar63._20_4_ = local_740._20_4_ * 0.0;
              auVar63._24_4_ = local_740._24_4_ * 0.0;
              auVar63._28_4_ = auVar135._28_4_;
              auVar113 = vfmadd231ps_fma(auVar63,ZEXT1632(auVar113),auVar135);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT1632(auVar88),auVar93);
              fVar125 = auVar89._0_4_;
              fVar124 = auVar89._4_4_;
              fVar104 = auVar89._8_4_;
              fVar106 = auVar89._12_4_;
              auVar148 = ZEXT1632(CONCAT412(fVar106 * auVar113._12_4_,
                                            CONCAT48(fVar104 * auVar113._8_4_,
                                                     CONCAT44(fVar124 * auVar113._4_4_,
                                                              fVar125 * auVar113._0_4_))));
              uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar149._4_4_ = uVar111;
              auVar149._0_4_ = uVar111;
              auVar149._8_4_ = uVar111;
              auVar149._12_4_ = uVar111;
              auVar149._16_4_ = uVar111;
              auVar149._20_4_ = uVar111;
              auVar149._24_4_ = uVar111;
              auVar149._28_4_ = uVar111;
              auVar73._4_4_ = uStack_fc;
              auVar73._0_4_ = local_100;
              auVar73._8_4_ = uStack_f8;
              auVar73._12_4_ = uStack_f4;
              auVar73._16_4_ = uStack_f0;
              auVar73._20_4_ = uStack_ec;
              auVar73._24_4_ = uStack_e8;
              auVar73._28_4_ = uStack_e4;
              auVar93 = vcmpps_avx(auVar73,auVar148,2);
              auVar135 = vcmpps_avx(auVar148,auVar149,2);
              auVar93 = vandps_avx(auVar135,auVar93);
              auVar89 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
              auVar12 = vpand_avx(auVar12,auVar89);
              auVar93 = vpmovsxwd_avx2(auVar12);
              if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar93 >> 0x7f,0) == '\0') &&
                    (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar93 >> 0xbf,0) == '\0') &&
                  (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar93[0x1f]) goto LAB_015f62d9;
              auVar93 = vcmpps_avx(ZEXT1632(auVar126),ZEXT832(0) << 0x20,4);
              auVar89 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
              auVar12 = vpand_avx(auVar12,auVar89);
              auVar93 = vpmovsxwd_avx2(auVar12);
              auVar150._8_8_ = uStack_5f8;
              auVar150._0_8_ = local_600;
              auVar150._16_8_ = uStack_5f0;
              auVar150._24_8_ = uStack_5e8;
              auVar185 = ZEXT3264(auVar180);
              auVar199 = ZEXT3264(auVar196);
              if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar93 >> 0x7f,0) != '\0') ||
                    (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar93 >> 0xbf,0) != '\0') ||
                  (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar93[0x1f] < '\0') {
                auVar102 = ZEXT1632(CONCAT412(fVar106 * auVar13._12_4_,
                                              CONCAT48(fVar104 * auVar13._8_4_,
                                                       CONCAT44(fVar124 * auVar13._4_4_,
                                                                fVar125 * auVar13._0_4_))));
                auVar64._28_4_ = SUB84(uStack_5e8,4);
                auVar64._0_28_ =
                     ZEXT1628(CONCAT412(fVar106 * auVar90._12_4_,
                                        CONCAT48(fVar104 * auVar90._8_4_,
                                                 CONCAT44(fVar124 * auVar90._4_4_,
                                                          fVar125 * auVar90._0_4_))));
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar135 = vsubps_avx(auVar176,auVar102);
                auVar135 = vblendvps_avx(auVar135,auVar102,auVar95);
                auVar185 = ZEXT3264(auVar135);
                auVar135 = vsubps_avx(auVar176,auVar64);
                local_500 = vblendvps_avx(auVar135,auVar64,auVar95);
                auVar145 = ZEXT3264(local_500);
                auVar199 = ZEXT3264(auVar148);
                auVar150 = auVar93;
              }
            }
            if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar150 >> 0x7f,0) == '\0') &&
                  (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0xbf,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar150[0x1f]) goto LAB_015f5da5;
            auVar93 = vsubps_avx(local_540,auVar142);
            local_720 = auVar185._0_32_;
            auVar12 = vfmadd213ps_fma(auVar93,local_720,auVar142);
            fVar125 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar65._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar125;
            auVar65._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar125;
            auVar65._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar125;
            auVar65._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar125;
            auVar65._16_4_ = fVar125 * 0.0;
            auVar65._20_4_ = fVar125 * 0.0;
            auVar65._24_4_ = fVar125 * 0.0;
            auVar65._28_4_ = fVar125;
            auVar148 = auVar199._0_32_;
            auVar93 = vcmpps_avx(auVar148,auVar65,6);
            auVar135 = auVar150 & auVar93;
            auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
            if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar135 >> 0x7f,0) != '\0') ||
                  (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar135 >> 0xbf,0) != '\0') ||
                (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar135[0x1f] < '\0') {
              auVar123._8_4_ = 0xbf800000;
              auVar123._0_8_ = 0xbf800000bf800000;
              auVar123._12_4_ = 0xbf800000;
              auVar123._16_4_ = 0xbf800000;
              auVar123._20_4_ = 0xbf800000;
              auVar123._24_4_ = 0xbf800000;
              auVar123._28_4_ = 0xbf800000;
              auVar143._8_4_ = 0x40000000;
              auVar143._0_8_ = 0x4000000040000000;
              auVar143._12_4_ = 0x40000000;
              auVar143._16_4_ = 0x40000000;
              auVar143._20_4_ = 0x40000000;
              auVar143._24_4_ = 0x40000000;
              auVar143._28_4_ = 0x40000000;
              auVar145 = ZEXT3264(auVar143);
              auVar12 = vfmadd213ps_fma(local_500,auVar143,auVar123);
              local_360 = ZEXT1632(auVar12);
              local_310 = local_6f0._0_8_;
              uStack_308 = local_6f0._8_8_;
              local_300 = local_790;
              uStack_2f8 = uStack_788;
              pGVar7 = (context->scene->geometries).items[(uint)local_8c0._4_4_].ptr;
              local_500 = local_360;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                bVar75 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar75 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar93 = vandps_avx(auVar93,auVar150);
                fVar125 = (float)local_320;
                auVar145 = ZEXT3264(CONCAT428(fVar125,CONCAT424(fVar125,CONCAT420(fVar125,CONCAT416(
                                                  fVar125,CONCAT412(fVar125,CONCAT48(fVar125,
                                                  CONCAT44(fVar125,fVar125))))))));
                local_2a0[0] = (fVar125 + auVar185._0_4_ + 0.0) * local_120;
                local_2a0[1] = (fVar125 + auVar185._4_4_ + 1.0) * fStack_11c;
                local_2a0[2] = (fVar125 + auVar185._8_4_ + 2.0) * fStack_118;
                local_2a0[3] = (fVar125 + auVar185._12_4_ + 3.0) * fStack_114;
                fStack_290 = (fVar125 + auVar185._16_4_ + 4.0) * fStack_110;
                fStack_28c = (fVar125 + auVar185._20_4_ + 5.0) * fStack_10c;
                fStack_288 = (fVar125 + auVar185._24_4_ + 6.0) * fStack_108;
                fStack_284 = fVar125 + auVar185._28_4_ + 7.0;
                local_500._0_8_ = auVar12._0_8_;
                local_500._8_8_ = auVar12._8_8_;
                local_280 = local_500._0_8_;
                uStack_278 = local_500._8_8_;
                uStack_270 = 0;
                uStack_268 = 0;
                local_260 = auVar148;
                uVar83 = vmovmskps_avx(auVar93);
                if (uVar83 == 0) {
                  bVar75 = 0;
LAB_015f6314:
                  auVar185 = ZEXT3264(local_720);
                  auVar199 = ZEXT3264(auVar148);
                  auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,
                                                  CONCAT416(fVar194,CONCAT412(fVar194,CONCAT48(
                                                  fVar194,CONCAT44(fVar194,fVar194))))))));
                }
                else {
                  uVar80 = (ulong)(uVar83 & 0xff);
                  local_860 = ZEXT1632(CONCAT88(auVar11._8_8_,uVar80));
                  lVar84 = 0;
                  for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                    lVar84 = lVar84 + 1;
                  }
                  local_940 = ZEXT1632(CONCAT88(auVar9._8_8_,lVar84));
                  local_740._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  _local_440 = *pauVar1;
                  local_380 = local_720;
                  local_340 = auVar148;
                  local_31c = iVar79;
                  local_2f0 = auVar14;
                  do {
                    local_1e0 = local_2a0[local_940._0_8_];
                    local_1c0 = *(undefined4 *)((long)&local_280 + local_940._0_8_ * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_260 + local_940._0_8_ * 4);
                    fVar104 = 1.0 - local_1e0;
                    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * fVar104)),
                                              ZEXT416((uint)(local_1e0 * fVar104)),
                                              ZEXT416(0xc0000000));
                    auVar9 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar104)),
                                             ZEXT416((uint)(local_1e0 * local_1e0)),
                                             ZEXT416(0x40000000));
                    fVar125 = auVar9._0_4_ * 3.0;
                    fVar124 = local_1e0 * local_1e0 * 3.0;
                    auVar160._0_4_ = fVar124 * (float)local_590._0_4_;
                    auVar160._4_4_ = fVar124 * (float)local_590._4_4_;
                    auVar160._8_4_ = fVar124 * fStack_588;
                    auVar160._12_4_ = fVar124 * fStack_584;
                    auVar132._4_4_ = fVar125;
                    auVar132._0_4_ = fVar125;
                    auVar132._8_4_ = fVar125;
                    auVar132._12_4_ = fVar125;
                    auVar9 = vfmadd132ps_fma(auVar132,auVar160,auVar14);
                    fVar125 = auVar11._0_4_ * 3.0;
                    auVar154._4_4_ = fVar125;
                    auVar154._0_4_ = fVar125;
                    auVar154._8_4_ = fVar125;
                    auVar154._12_4_ = fVar125;
                    auVar9 = vfmadd132ps_fma(auVar154,auVar9,auVar114);
                    fVar125 = fVar104 * fVar104 * -3.0;
                    local_770.context = context->user;
                    auVar133._4_4_ = fVar125;
                    auVar133._0_4_ = fVar125;
                    auVar133._8_4_ = fVar125;
                    auVar133._12_4_ = fVar125;
                    auVar11 = vfmadd132ps_fma(auVar133,auVar9,local_6f0);
                    local_240 = auVar11._0_4_;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    auVar9 = vmovshdup_avx(auVar11);
                    local_220 = auVar9._0_8_;
                    uStack_218 = local_220;
                    uStack_210 = local_220;
                    uStack_208 = local_220;
                    auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
                    auVar134._0_8_ = auVar9._0_8_;
                    auVar134._8_8_ = auVar134._0_8_;
                    local_200._16_8_ = auVar134._0_8_;
                    local_200._0_16_ = auVar134;
                    local_200._24_8_ = auVar134._0_8_;
                    auVar145 = ZEXT3264(local_200);
                    fStack_1dc = local_1e0;
                    fStack_1d8 = local_1e0;
                    fStack_1d4 = local_1e0;
                    fStack_1d0 = local_1e0;
                    fStack_1cc = local_1e0;
                    fStack_1c8 = local_1e0;
                    fStack_1c4 = local_1e0;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = local_580;
                    uStack_198 = CONCAT44(uStack_574,uStack_578);
                    uStack_190 = CONCAT44(uStack_56c,uStack_570);
                    uStack_188 = CONCAT44(uStack_564,uStack_568);
                    local_180._4_4_ = uStack_55c;
                    local_180._0_4_ = local_560;
                    local_180._8_4_ = uStack_558;
                    local_180._12_4_ = uStack_554;
                    local_180._16_4_ = uStack_550;
                    local_180._20_4_ = uStack_54c;
                    local_180._24_4_ = uStack_548;
                    local_180._28_4_ = uStack_544;
                    vpcmpeqd_avx2(local_180,local_180);
                    local_160 = (local_770.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_770.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_640 = local_3e0;
                    local_770.valid = (int *)local_640;
                    local_770.geometryUserPtr = pGVar7->userPtr;
                    local_770.hit = (RTCHitN *)&local_240;
                    local_770.N = 8;
                    local_770.ray = (RTCRayN *)ray;
                    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar145 = ZEXT1664(auVar134);
                      (*pGVar7->occlusionFilterN)(&local_770);
                    }
                    auVar135 = vpcmpeqd_avx2(local_640,_DAT_01faff00);
                    auVar93 = _DAT_01fe9960 & ~auVar135;
                    if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar93 >> 0x7f,0) == '\0') &&
                          (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar93 >> 0xbf,0) == '\0') &&
                        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar93[0x1f]) {
                      auVar135 = auVar135 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_770);
                      }
                      auVar93 = vpcmpeqd_avx2(local_640,_DAT_01faff00);
                      auVar135 = auVar93 ^ _DAT_01fe9960;
                      auVar144._8_4_ = 0xff800000;
                      auVar144._0_8_ = 0xff800000ff800000;
                      auVar144._12_4_ = 0xff800000;
                      auVar144._16_4_ = 0xff800000;
                      auVar144._20_4_ = 0xff800000;
                      auVar144._24_4_ = 0xff800000;
                      auVar144._28_4_ = 0xff800000;
                      auVar145 = ZEXT3264(auVar144);
                      auVar93 = vblendvps_avx(auVar144,*(undefined1 (*) [32])(local_770.ray + 0x100)
                                              ,auVar93);
                      *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar93;
                    }
                    if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar135 >> 0x7f,0) != '\0') ||
                          (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar135 >> 0xbf,0) != '\0') ||
                        (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar135[0x1f] < '\0') {
                      bVar75 = 1;
                      goto LAB_015f6314;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_740._0_4_;
                    uVar82 = local_860._0_8_ ^ 1L << (local_940._0_8_ & 0x3f);
                    bVar75 = 0;
                    local_860._0_8_ = uVar82;
                    lVar84 = 0;
                    for (uVar80 = uVar82; (uVar80 & 1) == 0;
                        uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                      lVar84 = lVar84 + 1;
                    }
                    local_940._0_8_ = lVar84;
                    auVar185 = ZEXT3264(local_720);
                    auVar199 = ZEXT3264(auVar148);
                    auVar171 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,
                                                  CONCAT416(fVar194,CONCAT412(fVar194,CONCAT48(
                                                  fVar194,CONCAT44(fVar194,fVar194))))))));
                  } while (uVar82 != 0);
                }
              }
              bVar77 = (bool)(bVar77 | bVar75);
            }
          }
          local_720 = auVar185._0_32_;
          local_8e0 = auVar199._0_32_;
          lVar81 = lVar81 + 8;
        } while ((int)lVar81 < iVar79);
      }
      if (bVar77) {
        return bVar77;
      }
      uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar92._4_4_ = uVar111;
      auVar92._0_4_ = uVar111;
      auVar92._8_4_ = uVar111;
      auVar92._12_4_ = uVar111;
      auVar9 = vcmpps_avx(local_400,auVar92,2);
      uVar83 = vmovmskps_avx(auVar9);
      uVar78 = uVar78 & uVar78 + 0xf & uVar83;
    } while (uVar78 != 0);
  }
  return bVar77;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }